

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv.hpp
# Opt level: O2

void spv::HasResultAndType(Op opcode,bool *hasResult,bool *hasResultType)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  
  bVar2 = false;
  *hasResultType = false;
  *hasResult = false;
  bVar1 = true;
  bVar3 = bVar2;
  switch(opcode) {
  case OpNop:
  case OpSourceContinued:
  case OpSource:
  case OpSourceExtension:
  case OpName:
  case OpMemberName:
  case OpLine:
  case OpExtension:
  case OpMemoryModel:
  case OpEntryPoint:
  case OpExecutionMode:
  case OpCapability:
  case OpTypeForwardPointer:
  case OpFunctionEnd:
  case OpStore:
  case OpCopyMemory:
  case OpCopyMemorySized:
  case OpDecorate:
  case OpMemberDecorate:
  case OpGroupDecorate:
  case OpGroupMemberDecorate:
  case OpImageWrite:
  case OpEmitVertex:
  case OpEndPrimitive:
  case OpEmitStreamVertex:
  case OpEndStreamPrimitive:
  case OpControlBarrier:
  case OpMemoryBarrier:
  case OpAtomicStore:
  case OpLoopMerge:
  case OpSelectionMerge:
  case OpBranch:
  case OpBranchConditional:
  case OpSwitch:
  case OpKill:
  case OpReturn:
  case OpReturnValue:
  case OpUnreachable:
  case OpLifetimeStart:
  case OpLifetimeStop:
  case OpGroupWaitEvents:
  case OpCommitReadPipe:
  case OpCommitWritePipe:
  case OpGroupCommitReadPipe:
  case OpGroupCommitWritePipe:
  case OpRetainEvent:
  case OpReleaseEvent:
  case OpSetUserEventStatus:
  case OpCaptureEventProfilingInfo:
  case OpNoLine:
  case OpAtomicFlagClear:
  case OpMemoryNamedBarrier:
  case OpModuleProcessed:
  case OpExecutionModeId:
  case OpDecorateId:
    goto switchD_002cdfa7_caseD_15c8;
  case OpUndef:
  case OpExtInst:
  case OpConstantTrue:
  case OpConstantFalse:
  case OpConstant:
  case OpConstantComposite:
  case OpConstantSampler:
  case OpConstantNull:
  case OpSpecConstantTrue:
  case OpSpecConstantFalse:
  case OpSpecConstant:
  case OpSpecConstantComposite:
  case OpSpecConstantOp:
  case OpFunction:
  case OpFunctionParameter:
  case OpFunctionCall:
  case OpVariable:
  case OpImageTexelPointer:
  case OpLoad:
  case OpAccessChain:
  case OpInBoundsAccessChain:
  case OpPtrAccessChain:
  case OpArrayLength:
  case OpGenericPtrMemSemantics:
  case OpInBoundsPtrAccessChain:
  case OpVectorExtractDynamic:
  case OpVectorInsertDynamic:
  case OpVectorShuffle:
  case OpCompositeConstruct:
  case OpCompositeExtract:
  case OpCompositeInsert:
  case OpCopyObject:
  case OpTranspose:
  case OpSampledImage:
  case OpImageSampleImplicitLod:
  case OpImageSampleExplicitLod:
  case OpImageSampleDrefImplicitLod:
  case OpImageSampleDrefExplicitLod:
  case OpImageSampleProjImplicitLod:
  case OpImageSampleProjExplicitLod:
  case OpImageSampleProjDrefImplicitLod:
  case OpImageSampleProjDrefExplicitLod:
  case OpImageFetch:
  case OpImageGather:
  case OpImageDrefGather:
  case OpImageRead:
  case OpImage:
  case OpImageQueryFormat:
  case OpImageQueryOrder:
  case OpImageQuerySizeLod:
  case OpImageQuerySize:
  case OpImageQueryLod:
  case OpImageQueryLevels:
  case OpImageQuerySamples:
  case OpConvertFToU:
  case OpConvertFToS:
  case OpConvertSToF:
  case OpConvertUToF:
  case OpUConvert:
  case OpSConvert:
  case OpFConvert:
  case OpQuantizeToF16:
  case OpConvertPtrToU:
  case OpSatConvertSToU:
  case OpSatConvertUToS:
  case OpConvertUToPtr:
  case OpPtrCastToGeneric:
  case OpGenericCastToPtr:
  case OpGenericCastToPtrExplicit:
  case OpBitcast:
  case OpSNegate:
  case OpFNegate:
  case OpIAdd:
  case OpFAdd:
  case OpISub:
  case OpFSub:
  case OpIMul:
  case OpFMul:
  case OpUDiv:
  case OpSDiv:
  case OpFDiv:
  case OpUMod:
  case OpSRem:
  case OpSMod:
  case OpFRem:
  case OpFMod:
  case OpVectorTimesScalar:
  case OpMatrixTimesScalar:
  case OpVectorTimesMatrix:
  case OpMatrixTimesVector:
  case OpMatrixTimesMatrix:
  case OpOuterProduct:
  case OpDot:
  case OpIAddCarry:
  case OpISubBorrow:
  case OpUMulExtended:
  case OpSMulExtended:
  case OpAny:
  case OpAll:
  case OpIsNan:
  case OpIsInf:
  case OpIsFinite:
  case OpIsNormal:
  case OpSignBitSet:
  case OpLessOrGreater:
  case OpOrdered:
  case OpUnordered:
  case OpLogicalEqual:
  case OpLogicalNotEqual:
  case OpLogicalOr:
  case OpLogicalAnd:
  case OpLogicalNot:
  case OpSelect:
  case OpIEqual:
  case OpINotEqual:
  case OpUGreaterThan:
  case OpSGreaterThan:
  case OpUGreaterThanEqual:
  case OpSGreaterThanEqual:
  case OpULessThan:
  case OpSLessThan:
  case OpULessThanEqual:
  case OpSLessThanEqual:
  case OpFOrdEqual:
  case OpFUnordEqual:
  case OpFOrdNotEqual:
  case OpFUnordNotEqual:
  case OpFOrdLessThan:
  case OpFUnordLessThan:
  case OpFOrdGreaterThan:
  case OpFUnordGreaterThan:
  case OpFOrdLessThanEqual:
  case OpFUnordLessThanEqual:
  case OpFOrdGreaterThanEqual:
  case OpFUnordGreaterThanEqual:
  case OpShiftRightLogical:
  case OpShiftRightArithmetic:
  case OpShiftLeftLogical:
  case OpBitwiseOr:
  case OpBitwiseXor:
  case OpBitwiseAnd:
  case OpNot:
  case OpBitFieldInsert:
  case OpBitFieldSExtract:
  case OpBitFieldUExtract:
  case OpBitReverse:
  case OpBitCount:
  case OpDPdx:
  case OpDPdy:
  case OpFwidth:
  case OpDPdxFine:
  case OpDPdyFine:
  case OpFwidthFine:
  case OpDPdxCoarse:
  case OpDPdyCoarse:
  case OpFwidthCoarse:
  case OpAtomicLoad:
  case OpAtomicExchange:
  case OpAtomicCompareExchange:
  case OpAtomicCompareExchangeWeak:
  case OpAtomicIIncrement:
  case OpAtomicIDecrement:
  case OpAtomicIAdd:
  case OpAtomicISub:
  case OpAtomicSMin:
  case OpAtomicUMin:
  case OpAtomicSMax:
  case OpAtomicUMax:
  case OpAtomicAnd:
  case OpAtomicOr:
  case OpAtomicXor:
  case OpPhi:
  case OpGroupAsyncCopy:
  case OpGroupAll:
  case OpGroupAny:
  case OpGroupBroadcast:
  case OpGroupIAdd:
  case OpGroupFAdd:
  case OpGroupFMin:
  case OpGroupUMin:
  case OpGroupSMin:
  case OpGroupFMax:
  case OpGroupUMax:
  case OpGroupSMax:
  case OpReadPipe:
  case OpWritePipe:
  case OpReservedReadPipe:
  case OpReservedWritePipe:
  case OpReserveReadPipePackets:
  case OpReserveWritePipePackets:
  case OpIsValidReserveId:
  case OpGetNumPipePackets:
  case OpGetMaxPipePackets:
  case OpGroupReserveReadPipePackets:
  case OpGroupReserveWritePipePackets:
  case OpEnqueueMarker:
  case OpEnqueueKernel:
  case OpGetKernelNDrangeSubGroupCount:
  case OpGetKernelNDrangeMaxSubGroupSize:
  case OpGetKernelWorkGroupSize:
  case OpGetKernelPreferredWorkGroupSizeMultiple:
  case OpCreateUserEvent:
  case OpIsValidEvent:
  case OpGetDefaultQueue:
  case OpBuildNDRange:
  case OpImageSparseSampleImplicitLod:
  case OpImageSparseSampleExplicitLod:
  case OpImageSparseSampleDrefImplicitLod:
  case OpImageSparseSampleDrefExplicitLod:
  case OpImageSparseSampleProjImplicitLod:
  case OpImageSparseSampleProjExplicitLod:
  case OpImageSparseSampleProjDrefImplicitLod:
  case OpImageSparseSampleProjDrefExplicitLod:
  case OpImageSparseFetch:
  case OpImageSparseGather:
  case OpImageSparseDrefGather:
  case OpImageSparseTexelsResident:
  case OpAtomicFlagTestAndSet:
  case OpImageSparseRead:
  case OpSizeOf:
  case OpConstantPipeStorage:
  case OpCreatePipeFromPipeStorage:
  case OpGetKernelLocalSizeForSubgroupCount:
  case OpGetKernelMaxNumSubgroups:
  case OpNamedBarrierInitialize:
  case OpGroupNonUniformElect:
  case OpGroupNonUniformAll:
  case OpGroupNonUniformAny:
  case OpGroupNonUniformAllEqual:
  case OpGroupNonUniformBroadcast:
  case OpGroupNonUniformBroadcastFirst:
  case OpGroupNonUniformBallot:
  case OpGroupNonUniformInverseBallot:
  case OpGroupNonUniformBallotBitExtract:
  case OpGroupNonUniformBallotBitCount:
  case OpGroupNonUniformBallotFindLSB:
  case OpGroupNonUniformBallotFindMSB:
  case OpGroupNonUniformShuffle:
  case OpGroupNonUniformShuffleXor:
  case OpGroupNonUniformShuffleUp:
  case OpGroupNonUniformShuffleDown:
  case OpGroupNonUniformIAdd:
  case OpGroupNonUniformFAdd:
  case OpGroupNonUniformIMul:
  case OpGroupNonUniformFMul:
  case OpGroupNonUniformSMin:
  case OpGroupNonUniformUMin:
  case OpGroupNonUniformFMin:
  case OpGroupNonUniformSMax:
  case OpGroupNonUniformUMax:
  case OpGroupNonUniformFMax:
  case OpGroupNonUniformBitwiseAnd:
  case OpGroupNonUniformBitwiseOr:
  case OpGroupNonUniformBitwiseXor:
  case OpGroupNonUniformLogicalAnd:
  case OpGroupNonUniformLogicalOr:
  case OpGroupNonUniformLogicalXor:
  case OpGroupNonUniformQuadBroadcast:
  case OpGroupNonUniformQuadSwap:
  case OpCopyLogical:
  case OpPtrEqual:
  case OpPtrNotEqual:
  case OpPtrDiff:
    break;
  case OpString:
  case OpExtInstImport:
  case OpTypeVoid:
  case OpTypeBool:
  case OpTypeInt:
  case OpTypeFloat:
  case OpTypeVector:
  case OpTypeMatrix:
  case OpTypeImage:
  case OpTypeSampler:
  case OpTypeSampledImage:
  case OpTypeArray:
  case OpTypeRuntimeArray:
  case OpTypeStruct:
  case OpTypeOpaque:
  case OpTypePointer:
  case OpTypeFunction:
  case OpTypeEvent:
  case OpTypeDeviceEvent:
  case OpTypeReserveId:
  case OpTypeQueue:
  case OpTypePipe:
  case OpDecorationGroup:
  case OpLabel:
  case OpTypePipeStorage:
  case OpTypeNamedBarrier:
switchD_002cdfa7_caseD_1644:
    bVar1 = false;
    break;
  case OpLine|OpUndef:
  case OpExtInst|OpUndef:
  case OpExecutionMode|OpSourceContinued:
  case OpTypePointer|OpLine:
  case OpConstantNull|OpUndef:
  case OpSpecConstantOp|OpUndef:
  case OpFunctionEnd|OpSourceContinued:
  case OpMemberDecorate|OpSourceExtension:
  case OpTranspose|OpUndef:
  case OpImageQuerySize|OpSourceExtension:
  case OpBitcast|OpUndef:
  case OpSMulExtended|OpUndef:
  case OpIAdd|OpCopyMemorySized:
  case OpIAdd|OpAccessChain:
  case OpBitReverse|OpSourceContinued:
  case OpDPdy|OpLine:
  case OpDPdy|OpLine|OpUndef:
  case OpEmitStreamVertex|OpSourceContinued:
  case OpEmitStreamVertex|OpSource:
  case OpControlBarrier|OpSourceContinued:
  case OpAtomicXor|OpUndef:
  case OpAtomicAnd|OpSourceExtension:
  case OpLifetimeStart|OpSourceContinued:
  case OpLifetimeStart|OpExecutionMode:
  case OpLifetimeStart|OpCapability:
  case OpGroupCommitWritePipe|OpUndef:
  case OpGroupCommitWritePipe|OpSourceContinued:
  case OpGroupNonUniformQuadSwap|OpUndef:
  case OpGroupNonUniformFMul|OpExecutionMode:
  case OpGroupNonUniformFMul|OpCapability:
  case OpGroupNonUniformFMul|OpExecutionMode|OpSourceContinued:
  case OpGroupNonUniformFMul|OpTypeVoid:
  case OpGroupNonUniformFMul|OpTypeBool:
  case OpGroupNonUniformFMul|OpTypeInt:
  case OpGroupNonUniformFMul|OpTypeFloat:
  case OpGroupNonUniformFMul|OpTypeVector:
  case OpGroupNonUniformFMul|OpTypeMatrix:
  case OpGroupNonUniformFMul|OpTypeImage:
  case OpGroupNonUniformFMul|OpTypeSampler:
  case OpGroupNonUniformFMul|OpTypeSampledImage:
  case OpGroupNonUniformFMul|OpTypeArray:
  case OpGroupNonUniformFMul|OpTypeRuntimeArray:
  case OpGroupNonUniformFMul|OpTypeStruct:
  case OpGroupNonUniformFMul|OpTypeOpaque:
  case OpLifetimeStart|OpIAdd:
  case OpLifetimeStart|OpFAdd:
  case OpLifetimeStart|OpISub:
  case OpLifetimeStart|OpFSub:
  case OpLifetimeStart|OpIMul:
  case OpLifetimeStart|OpFMul:
  case OpLifetimeStart|OpUDiv:
  case OpLifetimeStart|OpSDiv:
  case OpLifetimeStart|OpFDiv:
  case OpLifetimeStart|OpUMod:
  case OpLifetimeStart|OpSRem:
  case OpLifetimeStart|OpSMod:
  case OpLifetimeStart|OpFRem:
  case OpLifetimeStart|OpFMod:
  case OpLifetimeStart|OpVectorTimesScalar:
  case OpLifetimeStart|OpMatrixTimesScalar:
    goto switchD_002cdfa7_caseD_15cb;
  default:
    bVar3 = false;
    switch(opcode) {
    case OpSubgroupShuffleINTEL:
    case OpSubgroupShuffleDownINTEL:
    case OpSubgroupShuffleUpINTEL:
    case OpSubgroupShuffleXorINTEL:
    case OpSubgroupBlockReadINTEL:
    case OpSubgroupImageBlockReadINTEL:
    case OpSubgroupImageMediaBlockReadINTEL:
    case OpUCountLeadingZerosINTEL:
    case OpUCountTrailingZerosINTEL:
    case OpAbsISubINTEL:
    case OpAbsUSubINTEL:
    case OpIAddSatINTEL:
    case OpUAddSatINTEL:
    case OpIAverageINTEL:
    case OpUAverageINTEL:
    case OpIAverageRoundedINTEL:
    case OpUAverageRoundedINTEL:
    case OpISubSatINTEL:
    case OpUSubSatINTEL:
    case OpIMul32x16INTEL:
    case OpUMul32x16INTEL:
    case OpConstantFunctionPointerINTEL:
    case OpFunctionPointerCallINTEL:
    case OpAsmTargetINTEL:
    case OpAsmINTEL:
    case OpAsmCallINTEL:
    case OpAtomicFMinEXT:
    case OpAtomicFMaxEXT:
    case OpExpectKHR:
    case OpVmeImageINTEL:
    case OpSubgroupAvcMceGetDefaultInterBaseMultiReferencePenaltyINTEL:
    case OpSubgroupAvcMceSetInterBaseMultiReferencePenaltyINTEL:
    case OpSubgroupAvcMceGetDefaultInterShapePenaltyINTEL:
    case OpSubgroupAvcMceSetInterShapePenaltyINTEL:
    case OpSubgroupAvcMceGetDefaultInterDirectionPenaltyINTEL:
    case OpSubgroupAvcMceSetInterDirectionPenaltyINTEL:
    case OpSubgroupAvcMceGetDefaultIntraLumaShapePenaltyINTEL:
    case OpSubgroupAvcMceGetDefaultInterMotionVectorCostTableINTEL:
    case OpSubgroupAvcMceGetDefaultHighPenaltyCostTableINTEL:
    case OpSubgroupAvcMceGetDefaultMediumPenaltyCostTableINTEL:
    case OpSubgroupAvcMceGetDefaultLowPenaltyCostTableINTEL:
    case OpSubgroupAvcMceSetMotionVectorCostFunctionINTEL:
    case OpSubgroupAvcMceGetDefaultIntraLumaModePenaltyINTEL:
    case OpSubgroupAvcMceGetDefaultNonDcLumaIntraPenaltyINTEL:
    case OpSubgroupAvcMceGetDefaultIntraChromaModeBasePenaltyINTEL:
    case OpSubgroupAvcMceSetAcOnlyHaarINTEL:
    case OpSubgroupAvcMceSetSourceInterlacedFieldPolarityINTEL:
    case OpSubgroupAvcMceSetSingleReferenceInterlacedFieldPolarityINTEL:
    case OpSubgroupAvcMceSetDualReferenceInterlacedFieldPolaritiesINTEL:
    case OpSubgroupAvcMceConvertToImePayloadINTEL:
    case OpSubgroupAvcMceConvertToImeResultINTEL:
    case OpSubgroupAvcMceConvertToRefPayloadINTEL:
    case OpSubgroupAvcMceConvertToRefResultINTEL:
    case OpSubgroupAvcMceConvertToSicPayloadINTEL:
    case OpSubgroupAvcMceConvertToSicResultINTEL:
    case OpSubgroupAvcMceGetMotionVectorsINTEL:
    case OpSubgroupAvcMceGetInterDistortionsINTEL:
    case OpSubgroupAvcMceGetBestInterDistortionsINTEL:
    case OpSubgroupAvcMceGetInterMajorShapeINTEL:
    case OpSubgroupAvcMceGetInterMinorShapeINTEL:
    case OpSubgroupAvcMceGetInterDirectionsINTEL:
    case OpSubgroupAvcMceGetInterMotionVectorCountINTEL:
    case OpSubgroupAvcMceGetInterReferenceIdsINTEL:
    case OpSubgroupAvcMceGetInterReferenceInterlacedFieldPolaritiesINTEL:
    case OpSubgroupAvcImeInitializeINTEL:
    case OpSubgroupAvcImeSetSingleReferenceINTEL:
    case OpSubgroupAvcImeSetDualReferenceINTEL:
    case OpSubgroupAvcImeRefWindowSizeINTEL:
    case OpSubgroupAvcImeAdjustRefOffsetINTEL:
    case OpSubgroupAvcImeConvertToMcePayloadINTEL:
    case OpSubgroupAvcImeSetMaxMotionVectorCountINTEL:
    case OpSubgroupAvcImeSetUnidirectionalMixDisableINTEL:
    case OpSubgroupAvcImeSetEarlySearchTerminationThresholdINTEL:
    case OpSubgroupAvcImeSetWeightedSadINTEL:
    case OpSubgroupAvcImeEvaluateWithSingleReferenceINTEL:
    case OpSubgroupAvcImeEvaluateWithDualReferenceINTEL:
    case OpSubgroupAvcImeEvaluateWithSingleReferenceStreaminINTEL:
    case OpSubgroupAvcImeEvaluateWithDualReferenceStreaminINTEL:
    case OpSubgroupAvcImeEvaluateWithSingleReferenceStreamoutINTEL:
    case OpSubgroupAvcImeEvaluateWithDualReferenceStreamoutINTEL:
    case OpSubgroupAvcImeEvaluateWithSingleReferenceStreaminoutINTEL:
    case OpSubgroupAvcImeEvaluateWithDualReferenceStreaminoutINTEL:
    case OpSubgroupAvcImeConvertToMceResultINTEL:
    case OpSubgroupAvcImeGetSingleReferenceStreaminINTEL:
    case OpSubgroupAvcImeGetDualReferenceStreaminINTEL:
    case OpSubgroupAvcImeStripSingleReferenceStreamoutINTEL:
    case OpSubgroupAvcImeStripDualReferenceStreamoutINTEL:
    case OpSubgroupAvcImeGetStreamoutSingleReferenceMajorShapeMotionVectorsINTEL:
    case OpSubgroupAvcImeGetStreamoutSingleReferenceMajorShapeDistortionsINTEL:
    case OpSubgroupAvcImeGetStreamoutSingleReferenceMajorShapeReferenceIdsINTEL:
    case OpSubgroupAvcImeGetStreamoutDualReferenceMajorShapeMotionVectorsINTEL:
    case OpSubgroupAvcImeGetStreamoutDualReferenceMajorShapeDistortionsINTEL:
    case OpSubgroupAvcImeGetStreamoutDualReferenceMajorShapeReferenceIdsINTEL:
    case OpSubgroupAvcImeGetBorderReachedINTEL:
    case OpSubgroupAvcImeGetTruncatedSearchIndicationINTEL:
    case OpSubgroupAvcImeGetUnidirectionalEarlySearchTerminationINTEL:
    case OpSubgroupAvcImeGetWeightingPatternMinimumMotionVectorINTEL:
    case OpSubgroupAvcImeGetWeightingPatternMinimumDistortionINTEL:
    case OpSubgroupAvcFmeInitializeINTEL:
    case OpSubgroupAvcBmeInitializeINTEL:
    case OpSubgroupAvcRefConvertToMcePayloadINTEL:
    case OpSubgroupAvcRefSetBidirectionalMixDisableINTEL:
    case OpSubgroupAvcRefSetBilinearFilterEnableINTEL:
    case OpSubgroupAvcRefEvaluateWithSingleReferenceINTEL:
    case OpSubgroupAvcRefEvaluateWithDualReferenceINTEL:
    case OpSubgroupAvcRefEvaluateWithMultiReferenceINTEL:
    case OpSubgroupAvcRefEvaluateWithMultiReferenceInterlacedINTEL:
    case OpSubgroupAvcRefConvertToMceResultINTEL:
    case OpSubgroupAvcSicInitializeINTEL:
    case OpSubgroupAvcSicConfigureSkcINTEL:
    case OpSubgroupAvcSicConfigureIpeLumaINTEL:
    case OpSubgroupAvcSicConfigureIpeLumaChromaINTEL:
    case OpSubgroupAvcSicGetMotionVectorMaskINTEL:
    case OpSubgroupAvcSicConvertToMcePayloadINTEL:
    case OpSubgroupAvcSicSetIntraLumaShapePenaltyINTEL:
    case OpSubgroupAvcSicSetIntraLumaModeCostFunctionINTEL:
    case OpSubgroupAvcSicSetIntraChromaModeCostFunctionINTEL:
    case OpSubgroupAvcSicSetBilinearFilterEnableINTEL:
    case OpSubgroupAvcSicSetSkcForwardTransformEnableINTEL:
    case OpSubgroupAvcSicSetBlockBasedRawSkipSadINTEL:
    case OpSubgroupAvcSicEvaluateIpeINTEL:
    case OpSubgroupAvcSicEvaluateWithSingleReferenceINTEL:
    case OpSubgroupAvcSicEvaluateWithDualReferenceINTEL:
    case OpSubgroupAvcSicEvaluateWithMultiReferenceINTEL:
    case OpSubgroupAvcSicEvaluateWithMultiReferenceInterlacedINTEL:
    case OpSubgroupAvcSicConvertToMceResultINTEL:
    case OpSubgroupAvcSicGetIpeLumaShapeINTEL:
    case OpSubgroupAvcSicGetBestIpeLumaDistortionINTEL:
    case OpSubgroupAvcSicGetBestIpeChromaDistortionINTEL:
    case OpSubgroupAvcSicGetPackedIpeLumaModesINTEL:
    case OpSubgroupAvcSicGetIpeChromaModeINTEL:
    case OpSubgroupAvcSicGetPackedSkcLumaCountThresholdINTEL:
    case OpSubgroupAvcSicGetPackedSkcLumaSumThresholdINTEL:
    case OpSubgroupAvcSicGetInterRawSadsINTEL:
    case OpVariableLengthArrayINTEL:
    case OpSaveMemoryINTEL:
    case OpArbitraryFloatSinCosPiINTEL:
    case OpArbitraryFloatCastINTEL:
    case OpArbitraryFloatCastFromIntINTEL:
    case OpArbitraryFloatCastToIntINTEL:
    case OpArbitraryFloatAddINTEL:
    case OpArbitraryFloatSubINTEL:
    case OpArbitraryFloatMulINTEL:
    case OpArbitraryFloatDivINTEL:
    case OpArbitraryFloatGTINTEL:
    case OpArbitraryFloatGEINTEL:
    case OpArbitraryFloatLTINTEL:
    case OpArbitraryFloatLEINTEL:
    case OpArbitraryFloatEQINTEL:
    case OpArbitraryFloatRecipINTEL:
    case OpArbitraryFloatRSqrtINTEL:
    case OpArbitraryFloatCbrtINTEL:
    case OpArbitraryFloatHypotINTEL:
    case OpArbitraryFloatSqrtINTEL:
    case OpArbitraryFloatLogINTEL:
    case OpArbitraryFloatLog2INTEL:
    case OpArbitraryFloatLog10INTEL:
    case OpArbitraryFloatLog1pINTEL:
    case OpArbitraryFloatExpINTEL:
    case OpArbitraryFloatExp2INTEL:
    case OpArbitraryFloatExp10INTEL:
    case OpArbitraryFloatExpm1INTEL:
    case OpArbitraryFloatSinINTEL:
    case OpArbitraryFloatCosINTEL:
    case OpArbitraryFloatSinCosINTEL:
    case OpArbitraryFloatSinPiINTEL:
    case OpArbitraryFloatCosPiINTEL:
    case OpArbitraryFloatASinINTEL:
    case OpArbitraryFloatASinPiINTEL:
    case OpArbitraryFloatACosINTEL:
    case OpArbitraryFloatACosPiINTEL:
    case OpArbitraryFloatATanINTEL:
    case OpArbitraryFloatATanPiINTEL:
    case OpArbitraryFloatATan2INTEL:
    case OpArbitraryFloatPowINTEL:
    case OpArbitraryFloatPowRINTEL:
    case OpArbitraryFloatPowNINTEL:
    case OpFixedSqrtINTEL:
    case OpFixedRecipINTEL:
    case OpFixedRsqrtINTEL:
    case OpFixedSinINTEL:
    case OpFixedCosINTEL:
    case OpFixedSinCosINTEL:
    case OpFixedSinPiINTEL:
    case OpFixedCosPiINTEL:
    case OpFixedSinCosPiINTEL:
    case OpFixedLogINTEL:
    case OpFixedExpINTEL:
    case OpPtrCastToCrossWorkgroupINTEL:
    case OpCrossWorkgroupCastToPtrINTEL:
    case OpReadPipeBlockingINTEL:
    case OpWritePipeBlockingINTEL:
    case OpFPGARegINTEL:
    case OpRayQueryGetRayTMinKHR:
    case OpRayQueryGetRayFlagsKHR:
    case OpRayQueryGetIntersectionTKHR:
    case OpRayQueryGetIntersectionInstanceCustomIndexKHR:
    case OpRayQueryGetIntersectionInstanceIdKHR:
    case OpRayQueryGetIntersectionInstanceShaderBindingTableRecordOffsetKHR:
    case OpRayQueryGetIntersectionGeometryIndexKHR:
    case OpRayQueryGetIntersectionPrimitiveIndexKHR:
    case OpRayQueryGetIntersectionBarycentricsKHR:
    case OpRayQueryGetIntersectionFrontFaceKHR:
    case OpRayQueryGetIntersectionCandidateAABBOpaqueKHR:
    case OpRayQueryGetIntersectionObjectRayDirectionKHR:
    case OpRayQueryGetIntersectionObjectRayOriginKHR:
    case OpRayQueryGetWorldRayDirectionKHR:
    case OpRayQueryGetWorldRayOriginKHR:
    case OpRayQueryGetIntersectionObjectToWorldKHR:
    case OpRayQueryGetIntersectionWorldToObjectKHR:
    case OpAtomicFAddEXT:
    case OpCompositeConstructContinuedINTEL:
    case OpConvertFToBF16INTEL:
    case OpConvertBF16ToFINTEL:
    case OpArithmeticFenceEXT:
      break;
    case OpSubgroupBlockWriteINTEL:
    case OpSubgroupImageBlockWriteINTEL:
    case OpSubgroupImageMediaBlockWriteINTEL:
    case OpAssumeTrueKHR:
    case OpDecorateString:
    case OpMemberDecorateString:
    case OpRestoreMemoryINTEL:
    case OpLoopControlINTEL:
    case OpTypeStructContinuedINTEL:
    case OpConstantCompositeContinuedINTEL:
    case OpSpecConstantCompositeContinuedINTEL:
    case OpControlBarrierArriveINTEL:
    case OpControlBarrierWaitINTEL:
      goto switchD_002cdfa7_caseD_15c8;
    case OpSubgroupImageBlockWriteINTEL|OpUndef:
    case OpSubgroupImageMediaBlockReadINTEL|OpSourceContinued:
    case OpSubgroupImageMediaBlockReadINTEL|OpSource:
    case OpTensorLayoutSetClampValueNV|OpDPdy:
    case OpUMul32x16INTEL|OpUndef:
    case OpConstantFunctionPointerINTEL|OpSourceContinued:
    case OpConstantFunctionPointerINTEL|OpSource:
    case OpConstantFunctionPointerINTEL|OpSourceExtension:
    case OpConstantFunctionPointerINTEL|OpName:
    case OpConstantFunctionPointerINTEL|OpMemberName:
    case OpConstantFunctionPointerINTEL|OpString:
    case OpConstantFunctionPointerINTEL|OpLine:
    case OpConstantFunctionPointerINTEL|OpExtInst:
    case OpConstantFunctionPointerINTEL|OpExtInst|OpUndef:
    case OpConstantFunctionPointerINTEL|OpExecutionMode:
    case OpConstantFunctionPointerINTEL|OpCapability:
    case OpConstantFunctionPointerINTEL|OpExecutionMode|OpSourceContinued:
    case OpConstantFunctionPointerINTEL|OpTypeVoid:
    case OpConstantFunctionPointerINTEL|OpTypeBool:
    case OpConstantFunctionPointerINTEL|OpTypeInt:
    case OpConstantFunctionPointerINTEL|OpTypeFloat:
    case OpConstantFunctionPointerINTEL|OpTypeVector:
    case OpConstantFunctionPointerINTEL|OpTypeMatrix:
    case OpConstantFunctionPointerINTEL|OpTypeImage:
    case OpConstantFunctionPointerINTEL|OpTypeSampler:
    case OpConstantFunctionPointerINTEL|OpTypeSampledImage:
    case OpConstantFunctionPointerINTEL|OpTypeArray:
    case OpConstantFunctionPointerINTEL|OpTypeRuntimeArray:
    case OpDecorateString|OpSourceContinued:
    case OpDecorateString|OpSource:
    case OpDecorateString|OpSourceExtension:
    case OpDecorateString|OpName:
    case OpDecorateString|OpMemberName:
    case OpDecorateString|OpString:
    case OpDecorateString|OpLine:
    case OpDecorateString|OpLine|OpUndef:
    case OpDecorateString|OpExtension:
    case OpDecorateString|OpExtInstImport:
    case OpDecorateString|OpExtInst:
    case OpDecorateString|OpExtInst|OpUndef:
    case OpDecorateString|OpMemoryModel:
    case OpDecorateString|OpEntryPoint:
    case OpDecorateString|OpExecutionMode:
    case OpDecorateString|OpCapability:
    case OpDecorateString|OpExecutionMode|OpSourceContinued:
    case OpDecorateString|OpTypeVoid:
    case OpDecorateString|OpTypeBool:
    case OpDecorateString|OpTypeInt:
    case OpDecorateString|OpTypeFloat:
    case OpDecorateString|OpTypeVector:
    case OpDecorateString|OpTypeMatrix:
    case OpDecorateString|OpTypeImage:
    case OpDecorateString|OpTypeSampler:
    case OpDecorateString|OpTypeSampledImage:
    case OpDecorateString|OpTypeArray:
    case OpDecorateString|OpTypeRuntimeArray:
    case OpDecorateString|OpTypeStruct:
    case OpDecorateString|OpTypeOpaque:
    case OpDecorateString|OpTypePointer:
    case OpDecorateString|OpTypeFunction:
    case OpDecorateString|OpTypeEvent:
    case OpDecorateString|OpTypeDeviceEvent:
    case OpDecorateString|OpTypeReserveId:
    case OpDecorateString|OpTypeQueue:
    case OpDecorateString|OpTypePipe:
    case OpDecorateString|OpTypeForwardPointer:
    case OpDecorateString|OpTypePointer|OpLine:
    case OpDecorateString|OpConstantTrue:
    case OpDecorateString|OpConstantFalse:
    case OpDecorateString|OpConstant:
    case OpDecorateString|OpConstantComposite:
    case OpDecorateString|OpConstantSampler:
    case OpDecorateString|OpConstantNull:
    case OpDecorateString|OpConstantNull|OpUndef:
    case OpDecorateString|OpSpecConstantTrue:
    case OpDecorateString|OpSpecConstantFalse:
    case OpDecorateString|OpSpecConstant:
    case OpDecorateString|OpSpecConstantComposite:
    case OpDecorateString|OpSpecConstantOp:
    case OpDecorateString|OpSpecConstantOp|OpUndef:
    case OpDecorateString|OpFunction:
    case OpDecorateString|OpFunctionParameter:
    case OpDecorateString|OpFunctionEnd:
    case OpDecorateString|OpFunctionCall:
    case OpDecorateString|OpFunctionEnd|OpSourceContinued:
    case OpDecorateString|OpVariable:
    case OpDecorateString|OpImageTexelPointer:
    case OpDecorateString|OpLoad:
    case OpDecorateString|OpStore:
    case OpDecorateString|OpCopyMemory:
    case OpDecorateString|OpCopyMemorySized:
    case OpDecorateString|OpAccessChain:
    case OpDecorateString|OpInBoundsAccessChain:
    case OpSubgroupAvcSicGetInterRawSadsINTEL|OpUndef:
    case OpRestoreMemoryINTEL|OpUndef:
    case OpRestoreMemoryINTEL|OpSourceContinued:
    case OpRestoreMemoryINTEL|OpSource:
    case OpSubgroupAvcImeEvaluateWithDualReferenceStreaminINTEL|OpCopyMemorySized:
    case OpSubgroupAvcImeEvaluateWithDualReferenceStreaminINTEL|OpAccessChain:
    case OpSubgroupAvcImeEvaluateWithDualReferenceStreaminINTEL|OpInBoundsAccessChain:
    case OpSubgroupAvcImeEvaluateWithDualReferenceStreaminINTEL|OpPtrAccessChain:
    case OpSubgroupAvcImeEvaluateWithDualReferenceStreaminINTEL|OpArrayLength:
    case OpSubgroupAvcImeEvaluateWithDualReferenceStreaminINTEL|OpGenericPtrMemSemantics:
    case OpSubgroupAvcImeEvaluateWithDualReferenceStreaminINTEL|OpInBoundsPtrAccessChain:
    case OpSubgroupAvcImeEvaluateWithDualReferenceStreaminINTEL|OpDecorate:
    case OpSubgroupAvcImeEvaluateWithDualReferenceStreaminINTEL|OpMemberDecorate:
    case OpSubgroupAvcImeEvaluateWithDualReferenceStreaminINTEL|OpDecorationGroup:
    case OpSubgroupAvcImeEvaluateWithDualReferenceStreaminINTEL|OpGroupDecorate:
    case OpSubgroupAvcImeEvaluateWithDualReferenceStreaminINTEL|OpGroupMemberDecorate:
    case OpSubgroupAvcImeEvaluateWithDualReferenceStreaminINTEL|OpMemberDecorate|OpSourceExtension:
    case OpSubgroupAvcImeEvaluateWithDualReferenceStreaminINTEL|OpVectorExtractDynamic:
    case OpSubgroupAvcImeEvaluateWithDualReferenceStreaminINTEL|OpVectorInsertDynamic:
    case OpSubgroupAvcImeEvaluateWithDualReferenceStreaminINTEL|OpVectorShuffle:
    case OpArbitraryFloatSinCosPiINTEL|OpSourceExtension:
    case OpArbitraryFloatSinCosPiINTEL|OpName:
    case OpArbitraryFloatPowNINTEL|OpUndef:
    case OpArbitraryFloatPowINTEL|OpSourceExtension:
    case OpArbitraryFloatPowINTEL|OpName:
    case OpArbitraryFloatPowINTEL|OpMemberName:
    case OpDecorateString|OpLifetimeStart:
    case OpDecorateString|OpLifetimeStop:
    case OpDecorateString|OpLifetimeStart|OpSourceContinued:
    case OpDecorateString|OpGroupAsyncCopy:
    case OpDecorateString|OpGroupWaitEvents:
    case OpDecorateString|OpGroupAll:
    case OpDecorateString|OpGroupAny:
    case OpDecorateString|OpGroupBroadcast:
    case OpDecorateString|OpGroupIAdd:
    case OpDecorateString|OpGroupFAdd:
    case OpDecorateString|OpGroupFMin:
    case OpDecorateString|OpGroupUMin:
    case OpDecorateString|OpGroupSMin:
    case OpDecorateString|OpGroupFMax:
    case OpDecorateString|OpGroupUMax:
    case OpDecorateString|OpGroupSMax:
    case OpDecorateString|OpLifetimeStart|OpExecutionMode:
    case OpDecorateString|OpLifetimeStart|OpCapability:
    case OpDecorateString|OpReadPipe:
    case OpDecorateString|OpWritePipe:
    case OpDecorateString|OpReservedReadPipe:
    case OpDecorateString|OpReservedWritePipe:
    case OpDecorateString|OpReserveReadPipePackets:
    case OpAliasScopeDeclINTEL|OpSourceContinued:
    case OpAliasScopeDeclINTEL|OpSource:
    case OpAliasScopeDeclINTEL|OpSourceExtension:
    case OpAliasScopeDeclINTEL|OpName:
    case OpAliasScopeDeclINTEL|OpMemberName:
    case OpAliasScopeDeclINTEL|OpString:
    case OpDecorateString|OpGroupCommitWritePipe:
    case OpDecorateString|OpGroupCommitWritePipe|OpUndef:
    case OpDecorateString|OpGroupCommitWritePipe|OpSourceContinued:
    case OpPtrCastToCrossWorkgroupINTEL|OpUndef:
    case OpDecorateString|OpBuildNDRange:
    case OpDecorateString|OpImageSparseSampleImplicitLod:
    case OpCrossWorkgroupCastToPtrINTEL|OpUndef:
    case OpDecorateString|OpImageSparseSampleDrefExplicitLod:
    case OpDecorateString|OpImageSparseSampleProjImplicitLod:
    case OpDecorateString|OpImageSparseSampleProjExplicitLod:
    case OpDecorateString|OpImageSparseSampleProjDrefImplicitLod:
    case OpDecorateString|OpImageSparseSampleProjDrefExplicitLod:
    case OpDecorateString|OpImageSparseFetch:
    case OpDecorateString|OpImageSparseTexelsResident:
    case OpDecorateString|OpAtomicFlagTestAndSet:
    case OpDecorateString|OpAtomicFlagClear:
    case OpDecorateString|OpImageSparseRead:
    case OpDecorateString|OpSizeOf:
    case OpDecorateString|OpTypePipeStorage:
    case OpDecorateString|OpConstantPipeStorage:
    case OpDecorateString|OpCreatePipeFromPipeStorage:
    case OpDecorateString|OpGetKernelLocalSizeForSubgroupCount:
    case OpDecorateString|OpGetKernelMaxNumSubgroups:
    case OpDecorateString|OpTypeNamedBarrier:
    case OpDecorateString|OpNamedBarrierInitialize:
    case OpDecorateString|OpMemoryNamedBarrier:
    case OpDecorateString|OpModuleProcessed:
    case OpDecorateString|OpExecutionModeId:
    case OpDecorateString|OpDecorateId:
    case OpDecorateString|OpGroupNonUniformElect:
    case OpDecorateString|OpGroupNonUniformAll:
    case OpDecorateString|OpGroupNonUniformAny:
    case OpDecorateString|OpGroupNonUniformAllEqual:
    case OpDecorateString|OpGroupNonUniformBroadcast:
    case OpDecorateString|OpGroupNonUniformBroadcastFirst:
    case OpDecorateString|OpGroupNonUniformBallot:
    case OpDecorateString|OpGroupNonUniformInverseBallot:
    case OpDecorateString|OpGroupNonUniformBallotBitExtract:
    case OpDecorateString|OpGroupNonUniformBallotBitCount:
    case OpDecorateString|OpGroupNonUniformBallotFindLSB:
    case OpDecorateString|OpGroupNonUniformBallotFindMSB:
    case OpDecorateString|OpGroupNonUniformShuffle:
    case OpDecorateString|OpGroupNonUniformShuffleXor:
    case OpDecorateString|OpGroupNonUniformShuffleUp:
    case OpDecorateString|OpGroupNonUniformShuffleDown:
    case OpDecorateString|OpGroupNonUniformIAdd:
    case OpDecorateString|OpGroupNonUniformFAdd:
    case OpDecorateString|OpGroupNonUniformIMul:
    case OpDecorateString|OpGroupNonUniformFMul:
    case OpDecorateString|OpGroupNonUniformSMin:
    case OpDecorateString|OpGroupNonUniformUMin:
    case OpDecorateString|OpGroupNonUniformFMin:
    case OpDecorateString|OpGroupNonUniformSMax:
    case OpDecorateString|OpGroupNonUniformUMax:
    case OpDecorateString|OpGroupNonUniformFMax:
    case OpDecorateString|OpGroupNonUniformBitwiseAnd:
    case OpDecorateString|OpGroupNonUniformBitwiseOr:
    case OpDecorateString|OpGroupNonUniformBitwiseXor:
    case OpDecorateString|OpGroupNonUniformLogicalAnd:
    case OpDecorateString|OpGroupNonUniformLogicalOr:
    case OpDecorateString|OpGroupNonUniformLogicalXor:
    case OpDecorateString|OpGroupNonUniformQuadBroadcast:
    case OpDecorateString|OpGroupNonUniformQuadSwap:
    case OpDecorateString|OpGroupNonUniformQuadSwap|OpUndef:
    case OpDecorateString|OpGroupNonUniformFMul|OpExecutionMode:
    case OpDecorateString|OpGroupNonUniformFMul|OpCapability:
    case OpDecorateString|OpGroupNonUniformFMul|OpExecutionMode|OpSourceContinued:
    case OpDecorateString|OpGroupNonUniformFMul|OpTypeVoid:
    case OpDecorateString|OpGroupNonUniformFMul|OpTypeBool:
    case OpDecorateString|OpGroupNonUniformFMul|OpTypeInt:
    case OpDecorateString|OpGroupNonUniformFMul|OpTypeFloat:
    case OpDecorateString|OpGroupNonUniformFMul|OpTypeVector:
    case OpDecorateString|OpGroupNonUniformFMul|OpTypeMatrix:
    case OpDecorateString|OpGroupNonUniformFMul|OpTypeImage:
    case OpDecorateString|OpGroupNonUniformFMul|OpTypeSampler:
    case OpDecorateString|OpGroupNonUniformFMul|OpTypeSampledImage:
    case OpDecorateString|OpGroupNonUniformFMul|OpTypeArray:
    case OpDecorateString|OpGroupNonUniformFMul|OpTypeRuntimeArray:
    case OpDecorateString|OpGroupNonUniformFMul|OpTypeStruct:
    case OpDecorateString|OpGroupNonUniformFMul|OpTypeOpaque:
    case OpRayQueryGetIntersectionWorldToObjectKHR|OpUndef:
    case OpRayQueryGetIntersectionWorldToObjectKHR|OpSourceContinued:
    case OpRayQueryGetIntersectionWorldToObjectKHR|OpSourceExtension:
    case OpRayQueryGetIntersectionWorldToObjectKHR|OpName:
    case OpRayQueryGetIntersectionWorldToObjectKHR|OpMemberName:
    case OpRayQueryGetIntersectionWorldToObjectKHR|OpString:
    case OpRayQueryGetIntersectionWorldToObjectKHR|OpLine:
    case OpRayQueryGetIntersectionWorldToObjectKHR|OpLine|OpUndef:
    case OpRayQueryGetIntersectionWorldToObjectKHR|OpExtension:
    case OpRayQueryGetIntersectionWorldToObjectKHR|OpExtInstImport:
    case OpRayQueryGetIntersectionWorldToObjectKHR|OpExtInst:
    case OpRayQueryGetIntersectionWorldToObjectKHR|OpExtInst|OpUndef:
    case OpRayQueryGetIntersectionWorldToObjectKHR|OpMemoryModel:
    case OpRayQueryGetIntersectionWorldToObjectKHR|OpEntryPoint:
    case OpRayQueryGetRayTMinKHR|OpTypePointer:
    case OpRayQueryGetRayTMinKHR|OpTypeFunction:
    case OpRayQueryGetRayTMinKHR|OpTypeEvent:
    case OpRayQueryGetRayTMinKHR|OpTypeDeviceEvent:
    case OpRayQueryGetRayTMinKHR|OpTypeReserveId:
    case OpRayQueryGetRayTMinKHR|OpTypeQueue:
    case OpRayQueryGetRayTMinKHR|OpTypePipe:
    case OpRayQueryGetRayTMinKHR|OpTypeForwardPointer:
    case OpRayQueryGetRayTMinKHR|OpTypePointer|OpLine:
    case OpRayQueryGetRayTMinKHR|OpConstantTrue:
    case OpRayQueryGetRayTMinKHR|OpConstantFalse:
    case OpRayQueryGetRayTMinKHR|OpConstant:
    case OpRayQueryGetRayTMinKHR|OpConstantComposite:
    case OpRayQueryGetRayTMinKHR|OpConstantSampler:
    case OpRayQueryGetRayTMinKHR|OpConstantNull:
    case OpRayQueryGetRayTMinKHR|OpConstantNull|OpUndef:
    case OpRayQueryGetRayTMinKHR|OpSpecConstantTrue:
    case OpRayQueryGetRayTMinKHR|OpSpecConstantFalse:
    case OpRayQueryGetRayTMinKHR|OpSpecConstant:
    case OpRayQueryGetRayTMinKHR|OpSpecConstantComposite:
    case OpRayQueryGetRayTMinKHR|OpSpecConstantOp:
    case OpRayQueryGetRayTMinKHR|OpSpecConstantOp|OpUndef:
    case OpRayQueryGetRayTMinKHR|OpFunction:
    case OpRayQueryGetRayTMinKHR|OpFunctionParameter:
    case OpRayQueryGetRayTMinKHR|OpFunctionEnd:
    case OpRayQueryGetRayTMinKHR|OpFunctionCall:
    case OpRayQueryGetRayTMinKHR|OpFunctionEnd|OpSourceContinued:
    case OpRayQueryGetRayTMinKHR|OpVariable:
    case OpRayQueryGetRayTMinKHR|OpImageTexelPointer:
    case OpRayQueryGetRayTMinKHR|OpLoad:
    case OpRayQueryGetRayTMinKHR|OpStore:
    case OpRayQueryGetRayTMinKHR|OpCopyMemory:
    case OpRayQueryGetRayTMinKHR|OpCopyMemorySized:
    case OpRayQueryGetRayTMinKHR|OpAccessChain:
    case OpRayQueryGetRayTMinKHR|OpInBoundsAccessChain:
    case OpRayQueryGetRayTMinKHR|OpPtrAccessChain:
    case OpRayQueryGetRayTMinKHR|OpArrayLength:
    case OpRayQueryGetRayTMinKHR|OpGenericPtrMemSemantics:
    case OpTypeBufferSurfaceINTEL|OpUndef:
    case OpRayQueryGetRayTMinKHR|OpMemberDecorate:
    case OpRayQueryGetRayTMinKHR|OpDecorationGroup:
    case OpSpecConstantCompositeContinuedINTEL|OpUndef:
    case OpSpecConstantCompositeContinuedINTEL|OpSourceContinued:
    case OpSpecConstantCompositeContinuedINTEL|OpSource:
    case OpCompositeConstructContinuedINTEL|OpUndef:
    case OpCompositeConstructContinuedINTEL|OpSourceContinued:
    case OpCompositeConstructContinuedINTEL|OpSource:
    case OpCompositeConstructContinuedINTEL|OpSourceExtension:
    case OpCompositeConstructContinuedINTEL|OpName:
    case OpCompositeConstructContinuedINTEL|OpMemberName:
    case OpCompositeConstructContinuedINTEL|OpString:
    case OpCompositeConstructContinuedINTEL|OpLine:
    case OpCompositeConstructContinuedINTEL|OpLine|OpUndef:
    case OpCompositeConstructContinuedINTEL|OpExtension:
    case OpCompositeConstructContinuedINTEL|OpExtInstImport:
    case OpCompositeConstructContinuedINTEL|OpExtInst:
    case OpCompositeConstructContinuedINTEL|OpExtInst|OpUndef:
    case OpCompositeConstructContinuedINTEL|OpMemoryModel:
    case OpCompositeConstructContinuedINTEL|OpEntryPoint:
    case OpRayQueryGetRayTMinKHR|OpImageGather:
    case OpRayQueryGetRayTMinKHR|OpImageDrefGather:
    case OpRayQueryGetRayTMinKHR|OpImageRead:
    case OpRayQueryGetRayTMinKHR|OpImageWrite:
    case OpConvertFToBF16INTEL|OpSourceContinued:
    case OpConvertFToBF16INTEL|OpSource:
    case OpRayQueryGetRayTMinKHR|OpImageQuerySize:
    case OpRayQueryGetRayTMinKHR|OpImageQueryLod:
    case OpRayQueryGetRayTMinKHR|OpImageQueryLevels:
    case OpRayQueryGetRayTMinKHR|OpImageQuerySamples:
    case OpRayQueryGetRayTMinKHR|OpImageQuerySize|OpSourceExtension:
    case OpRayQueryGetRayTMinKHR|OpConvertFToU:
    case OpRayQueryGetRayTMinKHR|OpConvertFToS:
    case OpRayQueryGetRayTMinKHR|OpConvertSToF:
    case OpRayQueryGetRayTMinKHR|OpConvertUToF:
    case OpRayQueryGetRayTMinKHR|OpUConvert:
    case OpRayQueryGetRayTMinKHR|OpSConvert:
    case OpRayQueryGetRayTMinKHR|OpFConvert:
    case OpRayQueryGetRayTMinKHR|OpQuantizeToF16:
    case OpRayQueryGetRayTMinKHR|OpConvertPtrToU:
    case OpRayQueryGetRayTMinKHR|OpSatConvertSToU:
    case OpRayQueryGetRayTMinKHR|OpSatConvertUToS:
    case OpRayQueryGetRayTMinKHR|OpConvertUToPtr:
    case OpRayQueryGetRayTMinKHR|OpPtrCastToGeneric:
    case OpRayQueryGetRayTMinKHR|OpGenericCastToPtr:
    case OpRayQueryGetRayTMinKHR|OpGenericCastToPtrExplicit:
    case OpRayQueryGetRayTMinKHR|OpBitcast:
    case OpRayQueryGetRayTMinKHR|OpBitcast|OpUndef:
    case 0x1800:
      goto switchD_002cdfa7_caseD_15cb;
    case OpTypeVmeImageINTEL:
    case OpTypeAvcImePayloadINTEL:
    case OpTypeAvcRefPayloadINTEL:
    case OpTypeAvcSicPayloadINTEL:
    case OpTypeAvcMcePayloadINTEL:
    case OpTypeAvcMceResultINTEL:
    case OpTypeAvcImeResultINTEL:
    case OpTypeAvcImeResultSingleReferenceStreamoutINTEL:
    case OpTypeAvcImeResultDualReferenceStreamoutINTEL:
    case OpTypeAvcImeSingleReferenceStreaminINTEL:
    case OpTypeAvcImeDualReferenceStreaminINTEL:
    case OpTypeAvcRefResultINTEL:
    case OpTypeAvcSicResultINTEL:
    case OpAliasDomainDeclINTEL:
    case OpAliasScopeDeclINTEL:
    case OpAliasScopeListDeclINTEL:
    case OpTypeBufferSurfaceINTEL:
      goto switchD_002cdfa7_caseD_1644;
    default:
      bVar3 = bVar2;
      switch(opcode) {
      case OpHitObjectRecordHitMotionNV:
      case OpHitObjectRecordHitWithIndexMotionNV:
      case OpHitObjectRecordMissMotionNV:
      case OpHitObjectTraceRayMotionNV:
      case OpHitObjectRecordEmptyNV:
      case OpHitObjectTraceRayNV:
      case OpHitObjectRecordHitNV:
      case OpHitObjectRecordHitWithIndexNV:
      case OpHitObjectRecordMissNV:
      case OpHitObjectExecuteShaderNV:
      case OpHitObjectGetAttributesNV:
      case OpReorderThreadWithHitObjectNV:
      case OpReorderThreadWithHintNV:
      case OpEmitMeshTasksEXT:
      case OpSetMeshOutputsEXT:
      case OpWritePackedPrimitiveIndices4x8NV:
      case OpIgnoreIntersectionNV:
      case OpTerminateRayNV:
      case OpTraceNV:
      case OpTraceMotionNV:
      case OpTraceRayMotionNV:
      case OpExecuteCallableNV:
      case OpCooperativeMatrixStoreNV:
      case OpBeginInvocationInterlockEXT:
      case OpEndInvocationInterlockEXT:
      case OpCooperativeMatrixStoreTensorNV:
      case OpDemoteToHelperInvocation:
      case OpSamplerImageAddressingModeNV:
        goto switchD_002cdfa7_caseD_15c8;
      case OpHitObjectGetWorldToObjectNV:
      case OpHitObjectGetObjectToWorldNV:
      case OpHitObjectGetObjectRayDirectionNV:
      case OpHitObjectGetObjectRayOriginNV:
      case OpHitObjectGetShaderRecordBufferHandleNV:
      case OpHitObjectGetShaderBindingTableRecordIndexNV:
      case OpHitObjectGetCurrentTimeNV:
      case OpHitObjectGetHitKindNV:
      case OpHitObjectGetPrimitiveIndexNV:
      case OpHitObjectGetGeometryIndexNV:
      case OpHitObjectGetInstanceIdNV:
      case OpHitObjectGetInstanceCustomIndexNV:
      case OpHitObjectGetWorldRayDirectionNV:
      case OpHitObjectGetWorldRayOriginNV:
      case OpHitObjectGetRayTMaxNV:
      case OpHitObjectGetRayTMinNV:
      case OpHitObjectIsEmptyNV:
      case OpHitObjectIsHitNV:
      case OpHitObjectIsMissNV:
      case OpImageSampleFootprintNV:
      case OpCooperativeMatrixConvertNV:
      case OpGroupNonUniformPartitionNV:
      case OpFetchMicroTriangleVertexPositionNV:
      case OpFetchMicroTriangleVertexBarycentricNV:
      case OpReportIntersectionKHR:
      case OpRayQueryGetIntersectionTriangleVertexPositionsKHR:
      case OpCooperativeMatrixLoadNV:
      case OpCooperativeMatrixMulAddNV:
      case OpCooperativeMatrixLengthNV:
      case OpCooperativeMatrixReduceNV:
      case OpCooperativeMatrixLoadTensorNV:
      case OpCooperativeMatrixPerElementOpNV:
      case OpCreateTensorLayoutNV:
      case OpTensorLayoutSetDimensionNV:
      case OpTensorLayoutSetStrideNV:
      case OpTensorLayoutSliceNV:
      case OpTensorLayoutSetClampValueNV:
      case OpCreateTensorViewNV:
      case OpTensorViewSetDimensionNV:
      case OpTensorViewSetStrideNV:
      case OpIsHelperInvocationEXT:
      case OpTensorViewSetClipNV:
      case OpTensorLayoutSetBlockSizeNV:
      case OpCooperativeMatrixTransposeNV:
      case OpConvertUToImageNV:
      case OpConvertUToSamplerNV:
      case OpConvertImageToUNV:
      case OpConvertSamplerToUNV:
      case OpConvertUToSampledImageNV:
      case OpConvertSampledImageToUNV:
      case OpRawAccessChainNV:
        break;
      case OpTypeHitObjectNV:
      case OpTypeAccelerationStructureKHR:
      case OpTypeCooperativeMatrixNV:
      case OpTypeTensorLayoutNV:
      case OpTypeTensorViewNV:
        goto switchD_002cdfa7_caseD_1644;
      case OpReorderThreadWithHintNV|OpSourceContinued:
      case OpReorderThreadWithHintNV|OpSourceExtension:
      case OpReorderThreadWithHintNV|OpName:
      case OpReorderThreadWithHintNV|OpMemberName:
      case OpReorderThreadWithHintNV|OpString:
      case OpTypeCooperativeVectorNV:
      case OpCooperativeVectorMatrixMulNV:
      case OpCooperativeVectorOuterProductAccumulateNV:
      case OpCooperativeVectorReduceSumAccumulateNV:
      case OpCooperativeVectorMatrixMulAddNV:
      case OpGroupNonUniformPartitionNV|OpUndef:
      case OpGroupNonUniformPartitionNV|OpSourceContinued:
      case OpCooperativeVectorLoadNV:
      case OpCooperativeVectorStoreNV:
      case OpGroupNonUniformPartitionNV|OpLine:
      case OpGroupNonUniformPartitionNV|OpLine|OpUndef:
      case OpGroupNonUniformPartitionNV|OpExtension:
      case OpGroupNonUniformPartitionNV|OpExtInstImport:
      case OpGroupNonUniformPartitionNV|OpExtInst:
      case OpGroupNonUniformPartitionNV|OpExtInst|OpUndef:
      case OpGroupNonUniformPartitionNV|OpMemoryModel:
      case OpGroupNonUniformPartitionNV|OpEntryPoint:
      case 0x14c0:
      case 0x14c1:
      case 0x14c2:
      case 0x14c3:
      case 0x14c4:
      case 0x14c5:
      case 0x14c6:
      case 0x14c7:
      case 0x14c8:
      case 0x14c9:
      case 0x14ca:
      case 0x14cb:
      case 0x14cc:
      case 0x14cd:
      case 0x14ce:
      case 0x14cf:
      case 0x14d0:
      case 0x14d1:
      case 0x14d2:
      case 0x14d3:
      case 0x14d4:
      case 0x14d5:
      case OpRayQueryGetIntersectionTriangleVertexPositionsKHR|OpSourceContinued:
      case OpRayQueryGetIntersectionTriangleVertexPositionsKHR|OpSource:
      case OpRayQueryGetClusterIdNV:
      case OpHitObjectGetClusterIdNV:
      case OpHitObjectGetClusterIdNV|OpUndef:
      case OpExecuteCallableNV|OpSourceExtension:
      case OpExecuteCallableNV|OpName:
      case OpExecuteCallableNV|OpMemberName:
      case OpExecuteCallableNV|OpString:
      case OpExecuteCallableNV|OpLine:
      case OpExecuteCallableNV|OpLine|OpUndef:
      case OpExecuteCallableNV|OpExtension:
      case OpExecuteCallableNV|OpExtInstImport:
      case OpExecuteCallableNV|OpExtInst:
      case OpExecuteCallableNV|OpExtInst|OpUndef:
      case OpCooperativeMatrixLengthNV|OpUndef:
      case OpTensorViewSetClipNV|OpUndef:
      case OpTensorLayoutSetBlockSizeNV|OpUndef:
      case OpTensorLayoutSetBlockSizeNV|OpSourceContinued:
      case OpTensorLayoutSetBlockSizeNV|OpSource:
      case OpTensorLayoutSetBlockSizeNV|OpSourceExtension:
      case OpTensorLayoutSetBlockSizeNV|OpName:
        goto switchD_002cdfa7_caseD_15cb;
      default:
        switch(opcode) {
        case OpTerminateInvocation:
        case OpUntypedPrefetchKHR:
        case OpTraceRayKHR:
        case OpExecuteCallableKHR:
        case OpIgnoreIntersectionKHR:
        case OpTerminateRayKHR:
        case OpCooperativeMatrixStoreKHR:
        case OpRayQueryInitializeKHR:
        case OpRayQueryTerminateKHR:
        case OpRayQueryGenerateIntersectionKHR:
        case OpRayQueryConfirmIntersectionKHR:
          goto switchD_002cdfa7_caseD_15c8;
        case OpTypeUntypedPointerKHR:
        case OpTypeCooperativeMatrixKHR:
        case OpTypeRayQueryKHR:
          goto switchD_002cdfa7_caseD_1644;
        case OpUntypedVariableKHR:
        case OpUntypedAccessChainKHR:
        case OpUntypedInBoundsAccessChainKHR:
        case OpSubgroupBallotKHR:
        case OpSubgroupFirstInvocationKHR:
        case OpUntypedPtrAccessChainKHR:
        case OpUntypedInBoundsPtrAccessChainKHR:
        case OpUntypedArrayLengthKHR:
        case OpSubgroupAllKHR:
        case OpSubgroupAnyKHR:
        case OpSubgroupAllEqualKHR:
        case OpGroupNonUniformRotateKHR:
        case OpSubgroupReadInvocationKHR:
        case OpExtInstWithForwardRefsKHR:
        case OpConvertUToAccelerationStructureKHR:
        case OpSDot:
        case OpUDot:
        case OpSUDot:
        case OpSDotAccSat:
        case OpUDotAccSat:
        case OpSUDotAccSat:
        case OpCooperativeMatrixLoadKHR:
        case OpCooperativeMatrixMulAddKHR:
        case OpCooperativeMatrixLengthKHR:
        case OpConstantCompositeReplicateEXT:
        case OpSpecConstantCompositeReplicateEXT:
        case OpCompositeConstructReplicateEXT:
        case OpRayQueryProceedKHR:
        case OpRayQueryGetIntersectionTypeKHR:
        case OpImageSampleWeightedQCOM:
        case OpImageBoxFilterQCOM:
        case OpImageBlockMatchSSDQCOM:
        case OpImageBlockMatchSADQCOM:
        case OpImageBlockMatchWindowSSDQCOM:
        case OpImageBlockMatchWindowSADQCOM:
        case OpImageBlockMatchGatherSSDQCOM:
        case OpImageBlockMatchGatherSADQCOM:
          break;
        case OpUntypedPrefetchKHR|OpUndef:
        case OpSubgroupReadInvocationKHR|OpSourceContinued:
        case OpSubgroupReadInvocationKHR|OpSource:
        case OpSubgroupReadInvocationKHR|OpSourceExtension:
        case OpSubgroupReadInvocationKHR|OpName:
        case OpSubgroupReadInvocationKHR|OpMemberName:
        case OpSubgroupReadInvocationKHR|OpString:
        case OpSubgroupReadInvocationKHR|OpLine:
        case OpSubgroupReadInvocationKHR|OpLine|OpUndef:
        case OpSubgroupReadInvocationKHR|OpExtension:
        case OpSubgroupReadInvocationKHR|OpExtInstImport:
        case OpSubgroupReadInvocationKHR|OpExtInst:
        case OpIgnoreIntersectionKHR|OpExecutionMode:
        case OpIgnoreIntersectionKHR|OpCapability:
        case OpIgnoreIntersectionKHR|OpExecutionMode|OpSourceContinued:
        case OpIgnoreIntersectionKHR|OpTypeVoid:
        case OpIgnoreIntersectionKHR|OpTypeBool:
        case OpIgnoreIntersectionKHR|OpTypeInt:
        case OpIgnoreIntersectionKHR|OpTypeFloat:
        case OpIgnoreIntersectionKHR|OpTypeVector:
        case OpRayQueryConfirmIntersectionKHR|OpSourceContinued:
        case OpImageSampleWeightedQCOM|OpSourceExtension:
        case OpImageSampleWeightedQCOM|OpName:
        case OpImageSampleWeightedQCOM|OpMemberName:
        case OpImageSampleWeightedQCOM|OpString:
        case OpImageSampleWeightedQCOM|OpLine:
        case OpImageSampleWeightedQCOM|OpLine|OpUndef:
        case OpImageSampleWeightedQCOM|OpExtension:
        case OpImageSampleWeightedQCOM|OpExtInstImport:
        case OpImageSampleWeightedQCOM|OpExtInst:
        case OpImageSampleWeightedQCOM|OpExtInst|OpUndef:
        case OpImageSampleWeightedQCOM|OpMemoryModel:
        case OpImageSampleWeightedQCOM|OpEntryPoint:
        case OpImageSampleWeightedQCOM|OpExecutionMode:
        case OpImageSampleWeightedQCOM|OpCapability:
        case OpImageSampleWeightedQCOM|OpExecutionMode|OpSourceContinued:
        case OpImageSampleWeightedQCOM|OpTypeVoid:
          goto switchD_002cdfa7_caseD_15cb;
        default:
          if (((0x38 < opcode - OpGroupIAddNonUniformAMD) ||
              ((0x1000000000018ffU >> ((ulong)(opcode - OpGroupIAddNonUniformAMD) & 0x3f) & 1) == 0)
              ) && (7 < opcode - OpGroupIMulKHR)) {
            switch(opcode) {
            case OpIsNodePayloadValidAMDX:
            case OpGroupNonUniformQuadAllKHR:
            case OpGroupNonUniformQuadAnyKHR:
              break;
            case OpReadClockKHR|OpConstantNull:
            case OpSpecConstantStringAMDX|OpUndef:
            case OpSpecConstantStringAMDX|OpSourceContinued:
            case OpSpecConstantStringAMDX|OpSource:
            case OpSpecConstantStringAMDX|OpSourceExtension:
            case OpSpecConstantStringAMDX|OpName:
              goto switchD_002cdfa7_caseD_15cb;
            case OpConstantStringAMDX:
            case OpSpecConstantStringAMDX:
              goto switchD_002cdfa7_caseD_1644;
            default:
              switch(opcode) {
              case OpAllocateNodePayloadsAMDX:
              case OpFinishWritingNodePayloadAMDX:
                goto switchD_002cdfa7_caseD_15c3;
              case OpEnqueueNodePayloadsAMDX:
                break;
              case OpTypeNodePayloadArrayAMDX:
                goto switchD_002cdfa7_caseD_1644;
              case OpTypeNodePayloadArrayAMDX|OpUndef:
                goto switchD_002cdfa7_caseD_15cb;
              default:
                if ((opcode - OpColorAttachmentReadEXT < 3) ||
                   (opcode == OpNodePayloadArrayLengthAMDX)) goto switchD_002cdfa7_caseD_15c3;
                if (opcode != OpSubgroupBlockPrefetchINTEL) {
                  if (opcode == OpMaskedGatherINTEL) goto switchD_002cdfa7_caseD_15c3;
                  if (opcode != OpMaskedScatterINTEL) {
                    return;
                  }
                }
              }
              goto switchD_002cdfa7_caseD_15c8;
            }
          }
        }
      }
    }
  }
switchD_002cdfa7_caseD_15c3:
  *hasResult = true;
  bVar3 = bVar1;
switchD_002cdfa7_caseD_15c8:
  *hasResultType = bVar3;
switchD_002cdfa7_caseD_15cb:
  return;
}

Assistant:

inline void HasResultAndType(Op opcode, bool *hasResult, bool *hasResultType) {
    *hasResult = *hasResultType = false;
    switch (opcode) {
    default: /* unknown opcode */ break;
    case OpNop: *hasResult = false; *hasResultType = false; break;
    case OpUndef: *hasResult = true; *hasResultType = true; break;
    case OpSourceContinued: *hasResult = false; *hasResultType = false; break;
    case OpSource: *hasResult = false; *hasResultType = false; break;
    case OpSourceExtension: *hasResult = false; *hasResultType = false; break;
    case OpName: *hasResult = false; *hasResultType = false; break;
    case OpMemberName: *hasResult = false; *hasResultType = false; break;
    case OpString: *hasResult = true; *hasResultType = false; break;
    case OpLine: *hasResult = false; *hasResultType = false; break;
    case OpExtension: *hasResult = false; *hasResultType = false; break;
    case OpExtInstImport: *hasResult = true; *hasResultType = false; break;
    case OpExtInst: *hasResult = true; *hasResultType = true; break;
    case OpMemoryModel: *hasResult = false; *hasResultType = false; break;
    case OpEntryPoint: *hasResult = false; *hasResultType = false; break;
    case OpExecutionMode: *hasResult = false; *hasResultType = false; break;
    case OpCapability: *hasResult = false; *hasResultType = false; break;
    case OpTypeVoid: *hasResult = true; *hasResultType = false; break;
    case OpTypeBool: *hasResult = true; *hasResultType = false; break;
    case OpTypeInt: *hasResult = true; *hasResultType = false; break;
    case OpTypeFloat: *hasResult = true; *hasResultType = false; break;
    case OpTypeVector: *hasResult = true; *hasResultType = false; break;
    case OpTypeMatrix: *hasResult = true; *hasResultType = false; break;
    case OpTypeImage: *hasResult = true; *hasResultType = false; break;
    case OpTypeSampler: *hasResult = true; *hasResultType = false; break;
    case OpTypeSampledImage: *hasResult = true; *hasResultType = false; break;
    case OpTypeArray: *hasResult = true; *hasResultType = false; break;
    case OpTypeRuntimeArray: *hasResult = true; *hasResultType = false; break;
    case OpTypeStruct: *hasResult = true; *hasResultType = false; break;
    case OpTypeOpaque: *hasResult = true; *hasResultType = false; break;
    case OpTypePointer: *hasResult = true; *hasResultType = false; break;
    case OpTypeFunction: *hasResult = true; *hasResultType = false; break;
    case OpTypeEvent: *hasResult = true; *hasResultType = false; break;
    case OpTypeDeviceEvent: *hasResult = true; *hasResultType = false; break;
    case OpTypeReserveId: *hasResult = true; *hasResultType = false; break;
    case OpTypeQueue: *hasResult = true; *hasResultType = false; break;
    case OpTypePipe: *hasResult = true; *hasResultType = false; break;
    case OpTypeForwardPointer: *hasResult = false; *hasResultType = false; break;
    case OpConstantTrue: *hasResult = true; *hasResultType = true; break;
    case OpConstantFalse: *hasResult = true; *hasResultType = true; break;
    case OpConstant: *hasResult = true; *hasResultType = true; break;
    case OpConstantComposite: *hasResult = true; *hasResultType = true; break;
    case OpConstantSampler: *hasResult = true; *hasResultType = true; break;
    case OpConstantNull: *hasResult = true; *hasResultType = true; break;
    case OpSpecConstantTrue: *hasResult = true; *hasResultType = true; break;
    case OpSpecConstantFalse: *hasResult = true; *hasResultType = true; break;
    case OpSpecConstant: *hasResult = true; *hasResultType = true; break;
    case OpSpecConstantComposite: *hasResult = true; *hasResultType = true; break;
    case OpSpecConstantOp: *hasResult = true; *hasResultType = true; break;
    case OpFunction: *hasResult = true; *hasResultType = true; break;
    case OpFunctionParameter: *hasResult = true; *hasResultType = true; break;
    case OpFunctionEnd: *hasResult = false; *hasResultType = false; break;
    case OpFunctionCall: *hasResult = true; *hasResultType = true; break;
    case OpVariable: *hasResult = true; *hasResultType = true; break;
    case OpImageTexelPointer: *hasResult = true; *hasResultType = true; break;
    case OpLoad: *hasResult = true; *hasResultType = true; break;
    case OpStore: *hasResult = false; *hasResultType = false; break;
    case OpCopyMemory: *hasResult = false; *hasResultType = false; break;
    case OpCopyMemorySized: *hasResult = false; *hasResultType = false; break;
    case OpAccessChain: *hasResult = true; *hasResultType = true; break;
    case OpInBoundsAccessChain: *hasResult = true; *hasResultType = true; break;
    case OpPtrAccessChain: *hasResult = true; *hasResultType = true; break;
    case OpArrayLength: *hasResult = true; *hasResultType = true; break;
    case OpGenericPtrMemSemantics: *hasResult = true; *hasResultType = true; break;
    case OpInBoundsPtrAccessChain: *hasResult = true; *hasResultType = true; break;
    case OpDecorate: *hasResult = false; *hasResultType = false; break;
    case OpMemberDecorate: *hasResult = false; *hasResultType = false; break;
    case OpDecorationGroup: *hasResult = true; *hasResultType = false; break;
    case OpGroupDecorate: *hasResult = false; *hasResultType = false; break;
    case OpGroupMemberDecorate: *hasResult = false; *hasResultType = false; break;
    case OpVectorExtractDynamic: *hasResult = true; *hasResultType = true; break;
    case OpVectorInsertDynamic: *hasResult = true; *hasResultType = true; break;
    case OpVectorShuffle: *hasResult = true; *hasResultType = true; break;
    case OpCompositeConstruct: *hasResult = true; *hasResultType = true; break;
    case OpCompositeExtract: *hasResult = true; *hasResultType = true; break;
    case OpCompositeInsert: *hasResult = true; *hasResultType = true; break;
    case OpCopyObject: *hasResult = true; *hasResultType = true; break;
    case OpTranspose: *hasResult = true; *hasResultType = true; break;
    case OpSampledImage: *hasResult = true; *hasResultType = true; break;
    case OpImageSampleImplicitLod: *hasResult = true; *hasResultType = true; break;
    case OpImageSampleExplicitLod: *hasResult = true; *hasResultType = true; break;
    case OpImageSampleDrefImplicitLod: *hasResult = true; *hasResultType = true; break;
    case OpImageSampleDrefExplicitLod: *hasResult = true; *hasResultType = true; break;
    case OpImageSampleProjImplicitLod: *hasResult = true; *hasResultType = true; break;
    case OpImageSampleProjExplicitLod: *hasResult = true; *hasResultType = true; break;
    case OpImageSampleProjDrefImplicitLod: *hasResult = true; *hasResultType = true; break;
    case OpImageSampleProjDrefExplicitLod: *hasResult = true; *hasResultType = true; break;
    case OpImageFetch: *hasResult = true; *hasResultType = true; break;
    case OpImageGather: *hasResult = true; *hasResultType = true; break;
    case OpImageDrefGather: *hasResult = true; *hasResultType = true; break;
    case OpImageRead: *hasResult = true; *hasResultType = true; break;
    case OpImageWrite: *hasResult = false; *hasResultType = false; break;
    case OpImage: *hasResult = true; *hasResultType = true; break;
    case OpImageQueryFormat: *hasResult = true; *hasResultType = true; break;
    case OpImageQueryOrder: *hasResult = true; *hasResultType = true; break;
    case OpImageQuerySizeLod: *hasResult = true; *hasResultType = true; break;
    case OpImageQuerySize: *hasResult = true; *hasResultType = true; break;
    case OpImageQueryLod: *hasResult = true; *hasResultType = true; break;
    case OpImageQueryLevels: *hasResult = true; *hasResultType = true; break;
    case OpImageQuerySamples: *hasResult = true; *hasResultType = true; break;
    case OpConvertFToU: *hasResult = true; *hasResultType = true; break;
    case OpConvertFToS: *hasResult = true; *hasResultType = true; break;
    case OpConvertSToF: *hasResult = true; *hasResultType = true; break;
    case OpConvertUToF: *hasResult = true; *hasResultType = true; break;
    case OpUConvert: *hasResult = true; *hasResultType = true; break;
    case OpSConvert: *hasResult = true; *hasResultType = true; break;
    case OpFConvert: *hasResult = true; *hasResultType = true; break;
    case OpQuantizeToF16: *hasResult = true; *hasResultType = true; break;
    case OpConvertPtrToU: *hasResult = true; *hasResultType = true; break;
    case OpSatConvertSToU: *hasResult = true; *hasResultType = true; break;
    case OpSatConvertUToS: *hasResult = true; *hasResultType = true; break;
    case OpConvertUToPtr: *hasResult = true; *hasResultType = true; break;
    case OpPtrCastToGeneric: *hasResult = true; *hasResultType = true; break;
    case OpGenericCastToPtr: *hasResult = true; *hasResultType = true; break;
    case OpGenericCastToPtrExplicit: *hasResult = true; *hasResultType = true; break;
    case OpBitcast: *hasResult = true; *hasResultType = true; break;
    case OpSNegate: *hasResult = true; *hasResultType = true; break;
    case OpFNegate: *hasResult = true; *hasResultType = true; break;
    case OpIAdd: *hasResult = true; *hasResultType = true; break;
    case OpFAdd: *hasResult = true; *hasResultType = true; break;
    case OpISub: *hasResult = true; *hasResultType = true; break;
    case OpFSub: *hasResult = true; *hasResultType = true; break;
    case OpIMul: *hasResult = true; *hasResultType = true; break;
    case OpFMul: *hasResult = true; *hasResultType = true; break;
    case OpUDiv: *hasResult = true; *hasResultType = true; break;
    case OpSDiv: *hasResult = true; *hasResultType = true; break;
    case OpFDiv: *hasResult = true; *hasResultType = true; break;
    case OpUMod: *hasResult = true; *hasResultType = true; break;
    case OpSRem: *hasResult = true; *hasResultType = true; break;
    case OpSMod: *hasResult = true; *hasResultType = true; break;
    case OpFRem: *hasResult = true; *hasResultType = true; break;
    case OpFMod: *hasResult = true; *hasResultType = true; break;
    case OpVectorTimesScalar: *hasResult = true; *hasResultType = true; break;
    case OpMatrixTimesScalar: *hasResult = true; *hasResultType = true; break;
    case OpVectorTimesMatrix: *hasResult = true; *hasResultType = true; break;
    case OpMatrixTimesVector: *hasResult = true; *hasResultType = true; break;
    case OpMatrixTimesMatrix: *hasResult = true; *hasResultType = true; break;
    case OpOuterProduct: *hasResult = true; *hasResultType = true; break;
    case OpDot: *hasResult = true; *hasResultType = true; break;
    case OpIAddCarry: *hasResult = true; *hasResultType = true; break;
    case OpISubBorrow: *hasResult = true; *hasResultType = true; break;
    case OpUMulExtended: *hasResult = true; *hasResultType = true; break;
    case OpSMulExtended: *hasResult = true; *hasResultType = true; break;
    case OpAny: *hasResult = true; *hasResultType = true; break;
    case OpAll: *hasResult = true; *hasResultType = true; break;
    case OpIsNan: *hasResult = true; *hasResultType = true; break;
    case OpIsInf: *hasResult = true; *hasResultType = true; break;
    case OpIsFinite: *hasResult = true; *hasResultType = true; break;
    case OpIsNormal: *hasResult = true; *hasResultType = true; break;
    case OpSignBitSet: *hasResult = true; *hasResultType = true; break;
    case OpLessOrGreater: *hasResult = true; *hasResultType = true; break;
    case OpOrdered: *hasResult = true; *hasResultType = true; break;
    case OpUnordered: *hasResult = true; *hasResultType = true; break;
    case OpLogicalEqual: *hasResult = true; *hasResultType = true; break;
    case OpLogicalNotEqual: *hasResult = true; *hasResultType = true; break;
    case OpLogicalOr: *hasResult = true; *hasResultType = true; break;
    case OpLogicalAnd: *hasResult = true; *hasResultType = true; break;
    case OpLogicalNot: *hasResult = true; *hasResultType = true; break;
    case OpSelect: *hasResult = true; *hasResultType = true; break;
    case OpIEqual: *hasResult = true; *hasResultType = true; break;
    case OpINotEqual: *hasResult = true; *hasResultType = true; break;
    case OpUGreaterThan: *hasResult = true; *hasResultType = true; break;
    case OpSGreaterThan: *hasResult = true; *hasResultType = true; break;
    case OpUGreaterThanEqual: *hasResult = true; *hasResultType = true; break;
    case OpSGreaterThanEqual: *hasResult = true; *hasResultType = true; break;
    case OpULessThan: *hasResult = true; *hasResultType = true; break;
    case OpSLessThan: *hasResult = true; *hasResultType = true; break;
    case OpULessThanEqual: *hasResult = true; *hasResultType = true; break;
    case OpSLessThanEqual: *hasResult = true; *hasResultType = true; break;
    case OpFOrdEqual: *hasResult = true; *hasResultType = true; break;
    case OpFUnordEqual: *hasResult = true; *hasResultType = true; break;
    case OpFOrdNotEqual: *hasResult = true; *hasResultType = true; break;
    case OpFUnordNotEqual: *hasResult = true; *hasResultType = true; break;
    case OpFOrdLessThan: *hasResult = true; *hasResultType = true; break;
    case OpFUnordLessThan: *hasResult = true; *hasResultType = true; break;
    case OpFOrdGreaterThan: *hasResult = true; *hasResultType = true; break;
    case OpFUnordGreaterThan: *hasResult = true; *hasResultType = true; break;
    case OpFOrdLessThanEqual: *hasResult = true; *hasResultType = true; break;
    case OpFUnordLessThanEqual: *hasResult = true; *hasResultType = true; break;
    case OpFOrdGreaterThanEqual: *hasResult = true; *hasResultType = true; break;
    case OpFUnordGreaterThanEqual: *hasResult = true; *hasResultType = true; break;
    case OpShiftRightLogical: *hasResult = true; *hasResultType = true; break;
    case OpShiftRightArithmetic: *hasResult = true; *hasResultType = true; break;
    case OpShiftLeftLogical: *hasResult = true; *hasResultType = true; break;
    case OpBitwiseOr: *hasResult = true; *hasResultType = true; break;
    case OpBitwiseXor: *hasResult = true; *hasResultType = true; break;
    case OpBitwiseAnd: *hasResult = true; *hasResultType = true; break;
    case OpNot: *hasResult = true; *hasResultType = true; break;
    case OpBitFieldInsert: *hasResult = true; *hasResultType = true; break;
    case OpBitFieldSExtract: *hasResult = true; *hasResultType = true; break;
    case OpBitFieldUExtract: *hasResult = true; *hasResultType = true; break;
    case OpBitReverse: *hasResult = true; *hasResultType = true; break;
    case OpBitCount: *hasResult = true; *hasResultType = true; break;
    case OpDPdx: *hasResult = true; *hasResultType = true; break;
    case OpDPdy: *hasResult = true; *hasResultType = true; break;
    case OpFwidth: *hasResult = true; *hasResultType = true; break;
    case OpDPdxFine: *hasResult = true; *hasResultType = true; break;
    case OpDPdyFine: *hasResult = true; *hasResultType = true; break;
    case OpFwidthFine: *hasResult = true; *hasResultType = true; break;
    case OpDPdxCoarse: *hasResult = true; *hasResultType = true; break;
    case OpDPdyCoarse: *hasResult = true; *hasResultType = true; break;
    case OpFwidthCoarse: *hasResult = true; *hasResultType = true; break;
    case OpEmitVertex: *hasResult = false; *hasResultType = false; break;
    case OpEndPrimitive: *hasResult = false; *hasResultType = false; break;
    case OpEmitStreamVertex: *hasResult = false; *hasResultType = false; break;
    case OpEndStreamPrimitive: *hasResult = false; *hasResultType = false; break;
    case OpControlBarrier: *hasResult = false; *hasResultType = false; break;
    case OpMemoryBarrier: *hasResult = false; *hasResultType = false; break;
    case OpAtomicLoad: *hasResult = true; *hasResultType = true; break;
    case OpAtomicStore: *hasResult = false; *hasResultType = false; break;
    case OpAtomicExchange: *hasResult = true; *hasResultType = true; break;
    case OpAtomicCompareExchange: *hasResult = true; *hasResultType = true; break;
    case OpAtomicCompareExchangeWeak: *hasResult = true; *hasResultType = true; break;
    case OpAtomicIIncrement: *hasResult = true; *hasResultType = true; break;
    case OpAtomicIDecrement: *hasResult = true; *hasResultType = true; break;
    case OpAtomicIAdd: *hasResult = true; *hasResultType = true; break;
    case OpAtomicISub: *hasResult = true; *hasResultType = true; break;
    case OpAtomicSMin: *hasResult = true; *hasResultType = true; break;
    case OpAtomicUMin: *hasResult = true; *hasResultType = true; break;
    case OpAtomicSMax: *hasResult = true; *hasResultType = true; break;
    case OpAtomicUMax: *hasResult = true; *hasResultType = true; break;
    case OpAtomicAnd: *hasResult = true; *hasResultType = true; break;
    case OpAtomicOr: *hasResult = true; *hasResultType = true; break;
    case OpAtomicXor: *hasResult = true; *hasResultType = true; break;
    case OpPhi: *hasResult = true; *hasResultType = true; break;
    case OpLoopMerge: *hasResult = false; *hasResultType = false; break;
    case OpSelectionMerge: *hasResult = false; *hasResultType = false; break;
    case OpLabel: *hasResult = true; *hasResultType = false; break;
    case OpBranch: *hasResult = false; *hasResultType = false; break;
    case OpBranchConditional: *hasResult = false; *hasResultType = false; break;
    case OpSwitch: *hasResult = false; *hasResultType = false; break;
    case OpKill: *hasResult = false; *hasResultType = false; break;
    case OpReturn: *hasResult = false; *hasResultType = false; break;
    case OpReturnValue: *hasResult = false; *hasResultType = false; break;
    case OpUnreachable: *hasResult = false; *hasResultType = false; break;
    case OpLifetimeStart: *hasResult = false; *hasResultType = false; break;
    case OpLifetimeStop: *hasResult = false; *hasResultType = false; break;
    case OpGroupAsyncCopy: *hasResult = true; *hasResultType = true; break;
    case OpGroupWaitEvents: *hasResult = false; *hasResultType = false; break;
    case OpGroupAll: *hasResult = true; *hasResultType = true; break;
    case OpGroupAny: *hasResult = true; *hasResultType = true; break;
    case OpGroupBroadcast: *hasResult = true; *hasResultType = true; break;
    case OpGroupIAdd: *hasResult = true; *hasResultType = true; break;
    case OpGroupFAdd: *hasResult = true; *hasResultType = true; break;
    case OpGroupFMin: *hasResult = true; *hasResultType = true; break;
    case OpGroupUMin: *hasResult = true; *hasResultType = true; break;
    case OpGroupSMin: *hasResult = true; *hasResultType = true; break;
    case OpGroupFMax: *hasResult = true; *hasResultType = true; break;
    case OpGroupUMax: *hasResult = true; *hasResultType = true; break;
    case OpGroupSMax: *hasResult = true; *hasResultType = true; break;
    case OpReadPipe: *hasResult = true; *hasResultType = true; break;
    case OpWritePipe: *hasResult = true; *hasResultType = true; break;
    case OpReservedReadPipe: *hasResult = true; *hasResultType = true; break;
    case OpReservedWritePipe: *hasResult = true; *hasResultType = true; break;
    case OpReserveReadPipePackets: *hasResult = true; *hasResultType = true; break;
    case OpReserveWritePipePackets: *hasResult = true; *hasResultType = true; break;
    case OpCommitReadPipe: *hasResult = false; *hasResultType = false; break;
    case OpCommitWritePipe: *hasResult = false; *hasResultType = false; break;
    case OpIsValidReserveId: *hasResult = true; *hasResultType = true; break;
    case OpGetNumPipePackets: *hasResult = true; *hasResultType = true; break;
    case OpGetMaxPipePackets: *hasResult = true; *hasResultType = true; break;
    case OpGroupReserveReadPipePackets: *hasResult = true; *hasResultType = true; break;
    case OpGroupReserveWritePipePackets: *hasResult = true; *hasResultType = true; break;
    case OpGroupCommitReadPipe: *hasResult = false; *hasResultType = false; break;
    case OpGroupCommitWritePipe: *hasResult = false; *hasResultType = false; break;
    case OpEnqueueMarker: *hasResult = true; *hasResultType = true; break;
    case OpEnqueueKernel: *hasResult = true; *hasResultType = true; break;
    case OpGetKernelNDrangeSubGroupCount: *hasResult = true; *hasResultType = true; break;
    case OpGetKernelNDrangeMaxSubGroupSize: *hasResult = true; *hasResultType = true; break;
    case OpGetKernelWorkGroupSize: *hasResult = true; *hasResultType = true; break;
    case OpGetKernelPreferredWorkGroupSizeMultiple: *hasResult = true; *hasResultType = true; break;
    case OpRetainEvent: *hasResult = false; *hasResultType = false; break;
    case OpReleaseEvent: *hasResult = false; *hasResultType = false; break;
    case OpCreateUserEvent: *hasResult = true; *hasResultType = true; break;
    case OpIsValidEvent: *hasResult = true; *hasResultType = true; break;
    case OpSetUserEventStatus: *hasResult = false; *hasResultType = false; break;
    case OpCaptureEventProfilingInfo: *hasResult = false; *hasResultType = false; break;
    case OpGetDefaultQueue: *hasResult = true; *hasResultType = true; break;
    case OpBuildNDRange: *hasResult = true; *hasResultType = true; break;
    case OpImageSparseSampleImplicitLod: *hasResult = true; *hasResultType = true; break;
    case OpImageSparseSampleExplicitLod: *hasResult = true; *hasResultType = true; break;
    case OpImageSparseSampleDrefImplicitLod: *hasResult = true; *hasResultType = true; break;
    case OpImageSparseSampleDrefExplicitLod: *hasResult = true; *hasResultType = true; break;
    case OpImageSparseSampleProjImplicitLod: *hasResult = true; *hasResultType = true; break;
    case OpImageSparseSampleProjExplicitLod: *hasResult = true; *hasResultType = true; break;
    case OpImageSparseSampleProjDrefImplicitLod: *hasResult = true; *hasResultType = true; break;
    case OpImageSparseSampleProjDrefExplicitLod: *hasResult = true; *hasResultType = true; break;
    case OpImageSparseFetch: *hasResult = true; *hasResultType = true; break;
    case OpImageSparseGather: *hasResult = true; *hasResultType = true; break;
    case OpImageSparseDrefGather: *hasResult = true; *hasResultType = true; break;
    case OpImageSparseTexelsResident: *hasResult = true; *hasResultType = true; break;
    case OpNoLine: *hasResult = false; *hasResultType = false; break;
    case OpAtomicFlagTestAndSet: *hasResult = true; *hasResultType = true; break;
    case OpAtomicFlagClear: *hasResult = false; *hasResultType = false; break;
    case OpImageSparseRead: *hasResult = true; *hasResultType = true; break;
    case OpSizeOf: *hasResult = true; *hasResultType = true; break;
    case OpTypePipeStorage: *hasResult = true; *hasResultType = false; break;
    case OpConstantPipeStorage: *hasResult = true; *hasResultType = true; break;
    case OpCreatePipeFromPipeStorage: *hasResult = true; *hasResultType = true; break;
    case OpGetKernelLocalSizeForSubgroupCount: *hasResult = true; *hasResultType = true; break;
    case OpGetKernelMaxNumSubgroups: *hasResult = true; *hasResultType = true; break;
    case OpTypeNamedBarrier: *hasResult = true; *hasResultType = false; break;
    case OpNamedBarrierInitialize: *hasResult = true; *hasResultType = true; break;
    case OpMemoryNamedBarrier: *hasResult = false; *hasResultType = false; break;
    case OpModuleProcessed: *hasResult = false; *hasResultType = false; break;
    case OpExecutionModeId: *hasResult = false; *hasResultType = false; break;
    case OpDecorateId: *hasResult = false; *hasResultType = false; break;
    case OpGroupNonUniformElect: *hasResult = true; *hasResultType = true; break;
    case OpGroupNonUniformAll: *hasResult = true; *hasResultType = true; break;
    case OpGroupNonUniformAny: *hasResult = true; *hasResultType = true; break;
    case OpGroupNonUniformAllEqual: *hasResult = true; *hasResultType = true; break;
    case OpGroupNonUniformBroadcast: *hasResult = true; *hasResultType = true; break;
    case OpGroupNonUniformBroadcastFirst: *hasResult = true; *hasResultType = true; break;
    case OpGroupNonUniformBallot: *hasResult = true; *hasResultType = true; break;
    case OpGroupNonUniformInverseBallot: *hasResult = true; *hasResultType = true; break;
    case OpGroupNonUniformBallotBitExtract: *hasResult = true; *hasResultType = true; break;
    case OpGroupNonUniformBallotBitCount: *hasResult = true; *hasResultType = true; break;
    case OpGroupNonUniformBallotFindLSB: *hasResult = true; *hasResultType = true; break;
    case OpGroupNonUniformBallotFindMSB: *hasResult = true; *hasResultType = true; break;
    case OpGroupNonUniformShuffle: *hasResult = true; *hasResultType = true; break;
    case OpGroupNonUniformShuffleXor: *hasResult = true; *hasResultType = true; break;
    case OpGroupNonUniformShuffleUp: *hasResult = true; *hasResultType = true; break;
    case OpGroupNonUniformShuffleDown: *hasResult = true; *hasResultType = true; break;
    case OpGroupNonUniformIAdd: *hasResult = true; *hasResultType = true; break;
    case OpGroupNonUniformFAdd: *hasResult = true; *hasResultType = true; break;
    case OpGroupNonUniformIMul: *hasResult = true; *hasResultType = true; break;
    case OpGroupNonUniformFMul: *hasResult = true; *hasResultType = true; break;
    case OpGroupNonUniformSMin: *hasResult = true; *hasResultType = true; break;
    case OpGroupNonUniformUMin: *hasResult = true; *hasResultType = true; break;
    case OpGroupNonUniformFMin: *hasResult = true; *hasResultType = true; break;
    case OpGroupNonUniformSMax: *hasResult = true; *hasResultType = true; break;
    case OpGroupNonUniformUMax: *hasResult = true; *hasResultType = true; break;
    case OpGroupNonUniformFMax: *hasResult = true; *hasResultType = true; break;
    case OpGroupNonUniformBitwiseAnd: *hasResult = true; *hasResultType = true; break;
    case OpGroupNonUniformBitwiseOr: *hasResult = true; *hasResultType = true; break;
    case OpGroupNonUniformBitwiseXor: *hasResult = true; *hasResultType = true; break;
    case OpGroupNonUniformLogicalAnd: *hasResult = true; *hasResultType = true; break;
    case OpGroupNonUniformLogicalOr: *hasResult = true; *hasResultType = true; break;
    case OpGroupNonUniformLogicalXor: *hasResult = true; *hasResultType = true; break;
    case OpGroupNonUniformQuadBroadcast: *hasResult = true; *hasResultType = true; break;
    case OpGroupNonUniformQuadSwap: *hasResult = true; *hasResultType = true; break;
    case OpCopyLogical: *hasResult = true; *hasResultType = true; break;
    case OpPtrEqual: *hasResult = true; *hasResultType = true; break;
    case OpPtrNotEqual: *hasResult = true; *hasResultType = true; break;
    case OpPtrDiff: *hasResult = true; *hasResultType = true; break;
    case OpColorAttachmentReadEXT: *hasResult = true; *hasResultType = true; break;
    case OpDepthAttachmentReadEXT: *hasResult = true; *hasResultType = true; break;
    case OpStencilAttachmentReadEXT: *hasResult = true; *hasResultType = true; break;
    case OpTerminateInvocation: *hasResult = false; *hasResultType = false; break;
    case OpTypeUntypedPointerKHR: *hasResult = true; *hasResultType = false; break;
    case OpUntypedVariableKHR: *hasResult = true; *hasResultType = true; break;
    case OpUntypedAccessChainKHR: *hasResult = true; *hasResultType = true; break;
    case OpUntypedInBoundsAccessChainKHR: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupBallotKHR: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupFirstInvocationKHR: *hasResult = true; *hasResultType = true; break;
    case OpUntypedPtrAccessChainKHR: *hasResult = true; *hasResultType = true; break;
    case OpUntypedInBoundsPtrAccessChainKHR: *hasResult = true; *hasResultType = true; break;
    case OpUntypedArrayLengthKHR: *hasResult = true; *hasResultType = true; break;
    case OpUntypedPrefetchKHR: *hasResult = false; *hasResultType = false; break;
    case OpSubgroupAllKHR: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAnyKHR: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAllEqualKHR: *hasResult = true; *hasResultType = true; break;
    case OpGroupNonUniformRotateKHR: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupReadInvocationKHR: *hasResult = true; *hasResultType = true; break;
    case OpExtInstWithForwardRefsKHR: *hasResult = true; *hasResultType = true; break;
    case OpTraceRayKHR: *hasResult = false; *hasResultType = false; break;
    case OpExecuteCallableKHR: *hasResult = false; *hasResultType = false; break;
    case OpConvertUToAccelerationStructureKHR: *hasResult = true; *hasResultType = true; break;
    case OpIgnoreIntersectionKHR: *hasResult = false; *hasResultType = false; break;
    case OpTerminateRayKHR: *hasResult = false; *hasResultType = false; break;
    case OpSDot: *hasResult = true; *hasResultType = true; break;
    case OpUDot: *hasResult = true; *hasResultType = true; break;
    case OpSUDot: *hasResult = true; *hasResultType = true; break;
    case OpSDotAccSat: *hasResult = true; *hasResultType = true; break;
    case OpUDotAccSat: *hasResult = true; *hasResultType = true; break;
    case OpSUDotAccSat: *hasResult = true; *hasResultType = true; break;
    case OpTypeCooperativeMatrixKHR: *hasResult = true; *hasResultType = false; break;
    case OpCooperativeMatrixLoadKHR: *hasResult = true; *hasResultType = true; break;
    case OpCooperativeMatrixStoreKHR: *hasResult = false; *hasResultType = false; break;
    case OpCooperativeMatrixMulAddKHR: *hasResult = true; *hasResultType = true; break;
    case OpCooperativeMatrixLengthKHR: *hasResult = true; *hasResultType = true; break;
    case OpConstantCompositeReplicateEXT: *hasResult = true; *hasResultType = true; break;
    case OpSpecConstantCompositeReplicateEXT: *hasResult = true; *hasResultType = true; break;
    case OpCompositeConstructReplicateEXT: *hasResult = true; *hasResultType = true; break;
    case OpTypeRayQueryKHR: *hasResult = true; *hasResultType = false; break;
    case OpRayQueryInitializeKHR: *hasResult = false; *hasResultType = false; break;
    case OpRayQueryTerminateKHR: *hasResult = false; *hasResultType = false; break;
    case OpRayQueryGenerateIntersectionKHR: *hasResult = false; *hasResultType = false; break;
    case OpRayQueryConfirmIntersectionKHR: *hasResult = false; *hasResultType = false; break;
    case OpRayQueryProceedKHR: *hasResult = true; *hasResultType = true; break;
    case OpRayQueryGetIntersectionTypeKHR: *hasResult = true; *hasResultType = true; break;
    case OpImageSampleWeightedQCOM: *hasResult = true; *hasResultType = true; break;
    case OpImageBoxFilterQCOM: *hasResult = true; *hasResultType = true; break;
    case OpImageBlockMatchSSDQCOM: *hasResult = true; *hasResultType = true; break;
    case OpImageBlockMatchSADQCOM: *hasResult = true; *hasResultType = true; break;
    case OpImageBlockMatchWindowSSDQCOM: *hasResult = true; *hasResultType = true; break;
    case OpImageBlockMatchWindowSADQCOM: *hasResult = true; *hasResultType = true; break;
    case OpImageBlockMatchGatherSSDQCOM: *hasResult = true; *hasResultType = true; break;
    case OpImageBlockMatchGatherSADQCOM: *hasResult = true; *hasResultType = true; break;
    case OpGroupIAddNonUniformAMD: *hasResult = true; *hasResultType = true; break;
    case OpGroupFAddNonUniformAMD: *hasResult = true; *hasResultType = true; break;
    case OpGroupFMinNonUniformAMD: *hasResult = true; *hasResultType = true; break;
    case OpGroupUMinNonUniformAMD: *hasResult = true; *hasResultType = true; break;
    case OpGroupSMinNonUniformAMD: *hasResult = true; *hasResultType = true; break;
    case OpGroupFMaxNonUniformAMD: *hasResult = true; *hasResultType = true; break;
    case OpGroupUMaxNonUniformAMD: *hasResult = true; *hasResultType = true; break;
    case OpGroupSMaxNonUniformAMD: *hasResult = true; *hasResultType = true; break;
    case OpFragmentMaskFetchAMD: *hasResult = true; *hasResultType = true; break;
    case OpFragmentFetchAMD: *hasResult = true; *hasResultType = true; break;
    case OpReadClockKHR: *hasResult = true; *hasResultType = true; break;
    case OpAllocateNodePayloadsAMDX: *hasResult = true; *hasResultType = true; break;
    case OpEnqueueNodePayloadsAMDX: *hasResult = false; *hasResultType = false; break;
    case OpTypeNodePayloadArrayAMDX: *hasResult = true; *hasResultType = false; break;
    case OpFinishWritingNodePayloadAMDX: *hasResult = true; *hasResultType = true; break;
    case OpNodePayloadArrayLengthAMDX: *hasResult = true; *hasResultType = true; break;
    case OpIsNodePayloadValidAMDX: *hasResult = true; *hasResultType = true; break;
    case OpConstantStringAMDX: *hasResult = true; *hasResultType = false; break;
    case OpSpecConstantStringAMDX: *hasResult = true; *hasResultType = false; break;
    case OpGroupNonUniformQuadAllKHR: *hasResult = true; *hasResultType = true; break;
    case OpGroupNonUniformQuadAnyKHR: *hasResult = true; *hasResultType = true; break;
    case OpHitObjectRecordHitMotionNV: *hasResult = false; *hasResultType = false; break;
    case OpHitObjectRecordHitWithIndexMotionNV: *hasResult = false; *hasResultType = false; break;
    case OpHitObjectRecordMissMotionNV: *hasResult = false; *hasResultType = false; break;
    case OpHitObjectGetWorldToObjectNV: *hasResult = true; *hasResultType = true; break;
    case OpHitObjectGetObjectToWorldNV: *hasResult = true; *hasResultType = true; break;
    case OpHitObjectGetObjectRayDirectionNV: *hasResult = true; *hasResultType = true; break;
    case OpHitObjectGetObjectRayOriginNV: *hasResult = true; *hasResultType = true; break;
    case OpHitObjectTraceRayMotionNV: *hasResult = false; *hasResultType = false; break;
    case OpHitObjectGetShaderRecordBufferHandleNV: *hasResult = true; *hasResultType = true; break;
    case OpHitObjectGetShaderBindingTableRecordIndexNV: *hasResult = true; *hasResultType = true; break;
    case OpHitObjectRecordEmptyNV: *hasResult = false; *hasResultType = false; break;
    case OpHitObjectTraceRayNV: *hasResult = false; *hasResultType = false; break;
    case OpHitObjectRecordHitNV: *hasResult = false; *hasResultType = false; break;
    case OpHitObjectRecordHitWithIndexNV: *hasResult = false; *hasResultType = false; break;
    case OpHitObjectRecordMissNV: *hasResult = false; *hasResultType = false; break;
    case OpHitObjectExecuteShaderNV: *hasResult = false; *hasResultType = false; break;
    case OpHitObjectGetCurrentTimeNV: *hasResult = true; *hasResultType = true; break;
    case OpHitObjectGetAttributesNV: *hasResult = false; *hasResultType = false; break;
    case OpHitObjectGetHitKindNV: *hasResult = true; *hasResultType = true; break;
    case OpHitObjectGetPrimitiveIndexNV: *hasResult = true; *hasResultType = true; break;
    case OpHitObjectGetGeometryIndexNV: *hasResult = true; *hasResultType = true; break;
    case OpHitObjectGetInstanceIdNV: *hasResult = true; *hasResultType = true; break;
    case OpHitObjectGetInstanceCustomIndexNV: *hasResult = true; *hasResultType = true; break;
    case OpHitObjectGetWorldRayDirectionNV: *hasResult = true; *hasResultType = true; break;
    case OpHitObjectGetWorldRayOriginNV: *hasResult = true; *hasResultType = true; break;
    case OpHitObjectGetRayTMaxNV: *hasResult = true; *hasResultType = true; break;
    case OpHitObjectGetRayTMinNV: *hasResult = true; *hasResultType = true; break;
    case OpHitObjectIsEmptyNV: *hasResult = true; *hasResultType = true; break;
    case OpHitObjectIsHitNV: *hasResult = true; *hasResultType = true; break;
    case OpHitObjectIsMissNV: *hasResult = true; *hasResultType = true; break;
    case OpReorderThreadWithHitObjectNV: *hasResult = false; *hasResultType = false; break;
    case OpReorderThreadWithHintNV: *hasResult = false; *hasResultType = false; break;
    case OpTypeHitObjectNV: *hasResult = true; *hasResultType = false; break;
    case OpImageSampleFootprintNV: *hasResult = true; *hasResultType = true; break;
    case OpCooperativeMatrixConvertNV: *hasResult = true; *hasResultType = true; break;
    case OpEmitMeshTasksEXT: *hasResult = false; *hasResultType = false; break;
    case OpSetMeshOutputsEXT: *hasResult = false; *hasResultType = false; break;
    case OpGroupNonUniformPartitionNV: *hasResult = true; *hasResultType = true; break;
    case OpWritePackedPrimitiveIndices4x8NV: *hasResult = false; *hasResultType = false; break;
    case OpFetchMicroTriangleVertexPositionNV: *hasResult = true; *hasResultType = true; break;
    case OpFetchMicroTriangleVertexBarycentricNV: *hasResult = true; *hasResultType = true; break;
    case OpReportIntersectionKHR: *hasResult = true; *hasResultType = true; break;
    case OpIgnoreIntersectionNV: *hasResult = false; *hasResultType = false; break;
    case OpTerminateRayNV: *hasResult = false; *hasResultType = false; break;
    case OpTraceNV: *hasResult = false; *hasResultType = false; break;
    case OpTraceMotionNV: *hasResult = false; *hasResultType = false; break;
    case OpTraceRayMotionNV: *hasResult = false; *hasResultType = false; break;
    case OpRayQueryGetIntersectionTriangleVertexPositionsKHR: *hasResult = true; *hasResultType = true; break;
    case OpTypeAccelerationStructureKHR: *hasResult = true; *hasResultType = false; break;
    case OpExecuteCallableNV: *hasResult = false; *hasResultType = false; break;
    case OpTypeCooperativeMatrixNV: *hasResult = true; *hasResultType = false; break;
    case OpCooperativeMatrixLoadNV: *hasResult = true; *hasResultType = true; break;
    case OpCooperativeMatrixStoreNV: *hasResult = false; *hasResultType = false; break;
    case OpCooperativeMatrixMulAddNV: *hasResult = true; *hasResultType = true; break;
    case OpCooperativeMatrixLengthNV: *hasResult = true; *hasResultType = true; break;
    case OpBeginInvocationInterlockEXT: *hasResult = false; *hasResultType = false; break;
    case OpEndInvocationInterlockEXT: *hasResult = false; *hasResultType = false; break;
    case OpCooperativeMatrixReduceNV: *hasResult = true; *hasResultType = true; break;
    case OpCooperativeMatrixLoadTensorNV: *hasResult = true; *hasResultType = true; break;
    case OpCooperativeMatrixStoreTensorNV: *hasResult = false; *hasResultType = false; break;
    case OpCooperativeMatrixPerElementOpNV: *hasResult = true; *hasResultType = true; break;
    case OpTypeTensorLayoutNV: *hasResult = true; *hasResultType = false; break;
    case OpTypeTensorViewNV: *hasResult = true; *hasResultType = false; break;
    case OpCreateTensorLayoutNV: *hasResult = true; *hasResultType = true; break;
    case OpTensorLayoutSetDimensionNV: *hasResult = true; *hasResultType = true; break;
    case OpTensorLayoutSetStrideNV: *hasResult = true; *hasResultType = true; break;
    case OpTensorLayoutSliceNV: *hasResult = true; *hasResultType = true; break;
    case OpTensorLayoutSetClampValueNV: *hasResult = true; *hasResultType = true; break;
    case OpCreateTensorViewNV: *hasResult = true; *hasResultType = true; break;
    case OpTensorViewSetDimensionNV: *hasResult = true; *hasResultType = true; break;
    case OpTensorViewSetStrideNV: *hasResult = true; *hasResultType = true; break;
    case OpDemoteToHelperInvocation: *hasResult = false; *hasResultType = false; break;
    case OpIsHelperInvocationEXT: *hasResult = true; *hasResultType = true; break;
    case OpTensorViewSetClipNV: *hasResult = true; *hasResultType = true; break;
    case OpTensorLayoutSetBlockSizeNV: *hasResult = true; *hasResultType = true; break;
    case OpCooperativeMatrixTransposeNV: *hasResult = true; *hasResultType = true; break;
    case OpConvertUToImageNV: *hasResult = true; *hasResultType = true; break;
    case OpConvertUToSamplerNV: *hasResult = true; *hasResultType = true; break;
    case OpConvertImageToUNV: *hasResult = true; *hasResultType = true; break;
    case OpConvertSamplerToUNV: *hasResult = true; *hasResultType = true; break;
    case OpConvertUToSampledImageNV: *hasResult = true; *hasResultType = true; break;
    case OpConvertSampledImageToUNV: *hasResult = true; *hasResultType = true; break;
    case OpSamplerImageAddressingModeNV: *hasResult = false; *hasResultType = false; break;
    case OpRawAccessChainNV: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupShuffleINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupShuffleDownINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupShuffleUpINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupShuffleXorINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupBlockReadINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupBlockWriteINTEL: *hasResult = false; *hasResultType = false; break;
    case OpSubgroupImageBlockReadINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupImageBlockWriteINTEL: *hasResult = false; *hasResultType = false; break;
    case OpSubgroupImageMediaBlockReadINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupImageMediaBlockWriteINTEL: *hasResult = false; *hasResultType = false; break;
    case OpUCountLeadingZerosINTEL: *hasResult = true; *hasResultType = true; break;
    case OpUCountTrailingZerosINTEL: *hasResult = true; *hasResultType = true; break;
    case OpAbsISubINTEL: *hasResult = true; *hasResultType = true; break;
    case OpAbsUSubINTEL: *hasResult = true; *hasResultType = true; break;
    case OpIAddSatINTEL: *hasResult = true; *hasResultType = true; break;
    case OpUAddSatINTEL: *hasResult = true; *hasResultType = true; break;
    case OpIAverageINTEL: *hasResult = true; *hasResultType = true; break;
    case OpUAverageINTEL: *hasResult = true; *hasResultType = true; break;
    case OpIAverageRoundedINTEL: *hasResult = true; *hasResultType = true; break;
    case OpUAverageRoundedINTEL: *hasResult = true; *hasResultType = true; break;
    case OpISubSatINTEL: *hasResult = true; *hasResultType = true; break;
    case OpUSubSatINTEL: *hasResult = true; *hasResultType = true; break;
    case OpIMul32x16INTEL: *hasResult = true; *hasResultType = true; break;
    case OpUMul32x16INTEL: *hasResult = true; *hasResultType = true; break;
    case OpConstantFunctionPointerINTEL: *hasResult = true; *hasResultType = true; break;
    case OpFunctionPointerCallINTEL: *hasResult = true; *hasResultType = true; break;
    case OpAsmTargetINTEL: *hasResult = true; *hasResultType = true; break;
    case OpAsmINTEL: *hasResult = true; *hasResultType = true; break;
    case OpAsmCallINTEL: *hasResult = true; *hasResultType = true; break;
    case OpAtomicFMinEXT: *hasResult = true; *hasResultType = true; break;
    case OpAtomicFMaxEXT: *hasResult = true; *hasResultType = true; break;
    case OpAssumeTrueKHR: *hasResult = false; *hasResultType = false; break;
    case OpExpectKHR: *hasResult = true; *hasResultType = true; break;
    case OpDecorateString: *hasResult = false; *hasResultType = false; break;
    case OpMemberDecorateString: *hasResult = false; *hasResultType = false; break;
    case OpVmeImageINTEL: *hasResult = true; *hasResultType = true; break;
    case OpTypeVmeImageINTEL: *hasResult = true; *hasResultType = false; break;
    case OpTypeAvcImePayloadINTEL: *hasResult = true; *hasResultType = false; break;
    case OpTypeAvcRefPayloadINTEL: *hasResult = true; *hasResultType = false; break;
    case OpTypeAvcSicPayloadINTEL: *hasResult = true; *hasResultType = false; break;
    case OpTypeAvcMcePayloadINTEL: *hasResult = true; *hasResultType = false; break;
    case OpTypeAvcMceResultINTEL: *hasResult = true; *hasResultType = false; break;
    case OpTypeAvcImeResultINTEL: *hasResult = true; *hasResultType = false; break;
    case OpTypeAvcImeResultSingleReferenceStreamoutINTEL: *hasResult = true; *hasResultType = false; break;
    case OpTypeAvcImeResultDualReferenceStreamoutINTEL: *hasResult = true; *hasResultType = false; break;
    case OpTypeAvcImeSingleReferenceStreaminINTEL: *hasResult = true; *hasResultType = false; break;
    case OpTypeAvcImeDualReferenceStreaminINTEL: *hasResult = true; *hasResultType = false; break;
    case OpTypeAvcRefResultINTEL: *hasResult = true; *hasResultType = false; break;
    case OpTypeAvcSicResultINTEL: *hasResult = true; *hasResultType = false; break;
    case OpSubgroupAvcMceGetDefaultInterBaseMultiReferencePenaltyINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcMceSetInterBaseMultiReferencePenaltyINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcMceGetDefaultInterShapePenaltyINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcMceSetInterShapePenaltyINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcMceGetDefaultInterDirectionPenaltyINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcMceSetInterDirectionPenaltyINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcMceGetDefaultIntraLumaShapePenaltyINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcMceGetDefaultInterMotionVectorCostTableINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcMceGetDefaultHighPenaltyCostTableINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcMceGetDefaultMediumPenaltyCostTableINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcMceGetDefaultLowPenaltyCostTableINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcMceSetMotionVectorCostFunctionINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcMceGetDefaultIntraLumaModePenaltyINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcMceGetDefaultNonDcLumaIntraPenaltyINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcMceGetDefaultIntraChromaModeBasePenaltyINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcMceSetAcOnlyHaarINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcMceSetSourceInterlacedFieldPolarityINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcMceSetSingleReferenceInterlacedFieldPolarityINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcMceSetDualReferenceInterlacedFieldPolaritiesINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcMceConvertToImePayloadINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcMceConvertToImeResultINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcMceConvertToRefPayloadINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcMceConvertToRefResultINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcMceConvertToSicPayloadINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcMceConvertToSicResultINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcMceGetMotionVectorsINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcMceGetInterDistortionsINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcMceGetBestInterDistortionsINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcMceGetInterMajorShapeINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcMceGetInterMinorShapeINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcMceGetInterDirectionsINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcMceGetInterMotionVectorCountINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcMceGetInterReferenceIdsINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcMceGetInterReferenceInterlacedFieldPolaritiesINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcImeInitializeINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcImeSetSingleReferenceINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcImeSetDualReferenceINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcImeRefWindowSizeINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcImeAdjustRefOffsetINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcImeConvertToMcePayloadINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcImeSetMaxMotionVectorCountINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcImeSetUnidirectionalMixDisableINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcImeSetEarlySearchTerminationThresholdINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcImeSetWeightedSadINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcImeEvaluateWithSingleReferenceINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcImeEvaluateWithDualReferenceINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcImeEvaluateWithSingleReferenceStreaminINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcImeEvaluateWithDualReferenceStreaminINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcImeEvaluateWithSingleReferenceStreamoutINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcImeEvaluateWithDualReferenceStreamoutINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcImeEvaluateWithSingleReferenceStreaminoutINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcImeEvaluateWithDualReferenceStreaminoutINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcImeConvertToMceResultINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcImeGetSingleReferenceStreaminINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcImeGetDualReferenceStreaminINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcImeStripSingleReferenceStreamoutINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcImeStripDualReferenceStreamoutINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcImeGetStreamoutSingleReferenceMajorShapeMotionVectorsINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcImeGetStreamoutSingleReferenceMajorShapeDistortionsINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcImeGetStreamoutSingleReferenceMajorShapeReferenceIdsINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcImeGetStreamoutDualReferenceMajorShapeMotionVectorsINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcImeGetStreamoutDualReferenceMajorShapeDistortionsINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcImeGetStreamoutDualReferenceMajorShapeReferenceIdsINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcImeGetBorderReachedINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcImeGetTruncatedSearchIndicationINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcImeGetUnidirectionalEarlySearchTerminationINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcImeGetWeightingPatternMinimumMotionVectorINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcImeGetWeightingPatternMinimumDistortionINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcFmeInitializeINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcBmeInitializeINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcRefConvertToMcePayloadINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcRefSetBidirectionalMixDisableINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcRefSetBilinearFilterEnableINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcRefEvaluateWithSingleReferenceINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcRefEvaluateWithDualReferenceINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcRefEvaluateWithMultiReferenceINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcRefEvaluateWithMultiReferenceInterlacedINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcRefConvertToMceResultINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcSicInitializeINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcSicConfigureSkcINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcSicConfigureIpeLumaINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcSicConfigureIpeLumaChromaINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcSicGetMotionVectorMaskINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcSicConvertToMcePayloadINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcSicSetIntraLumaShapePenaltyINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcSicSetIntraLumaModeCostFunctionINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcSicSetIntraChromaModeCostFunctionINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcSicSetBilinearFilterEnableINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcSicSetSkcForwardTransformEnableINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcSicSetBlockBasedRawSkipSadINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcSicEvaluateIpeINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcSicEvaluateWithSingleReferenceINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcSicEvaluateWithDualReferenceINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcSicEvaluateWithMultiReferenceINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcSicEvaluateWithMultiReferenceInterlacedINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcSicConvertToMceResultINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcSicGetIpeLumaShapeINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcSicGetBestIpeLumaDistortionINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcSicGetBestIpeChromaDistortionINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcSicGetPackedIpeLumaModesINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcSicGetIpeChromaModeINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcSicGetPackedSkcLumaCountThresholdINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcSicGetPackedSkcLumaSumThresholdINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupAvcSicGetInterRawSadsINTEL: *hasResult = true; *hasResultType = true; break;
    case OpVariableLengthArrayINTEL: *hasResult = true; *hasResultType = true; break;
    case OpSaveMemoryINTEL: *hasResult = true; *hasResultType = true; break;
    case OpRestoreMemoryINTEL: *hasResult = false; *hasResultType = false; break;
    case OpArbitraryFloatSinCosPiINTEL: *hasResult = true; *hasResultType = true; break;
    case OpArbitraryFloatCastINTEL: *hasResult = true; *hasResultType = true; break;
    case OpArbitraryFloatCastFromIntINTEL: *hasResult = true; *hasResultType = true; break;
    case OpArbitraryFloatCastToIntINTEL: *hasResult = true; *hasResultType = true; break;
    case OpArbitraryFloatAddINTEL: *hasResult = true; *hasResultType = true; break;
    case OpArbitraryFloatSubINTEL: *hasResult = true; *hasResultType = true; break;
    case OpArbitraryFloatMulINTEL: *hasResult = true; *hasResultType = true; break;
    case OpArbitraryFloatDivINTEL: *hasResult = true; *hasResultType = true; break;
    case OpArbitraryFloatGTINTEL: *hasResult = true; *hasResultType = true; break;
    case OpArbitraryFloatGEINTEL: *hasResult = true; *hasResultType = true; break;
    case OpArbitraryFloatLTINTEL: *hasResult = true; *hasResultType = true; break;
    case OpArbitraryFloatLEINTEL: *hasResult = true; *hasResultType = true; break;
    case OpArbitraryFloatEQINTEL: *hasResult = true; *hasResultType = true; break;
    case OpArbitraryFloatRecipINTEL: *hasResult = true; *hasResultType = true; break;
    case OpArbitraryFloatRSqrtINTEL: *hasResult = true; *hasResultType = true; break;
    case OpArbitraryFloatCbrtINTEL: *hasResult = true; *hasResultType = true; break;
    case OpArbitraryFloatHypotINTEL: *hasResult = true; *hasResultType = true; break;
    case OpArbitraryFloatSqrtINTEL: *hasResult = true; *hasResultType = true; break;
    case OpArbitraryFloatLogINTEL: *hasResult = true; *hasResultType = true; break;
    case OpArbitraryFloatLog2INTEL: *hasResult = true; *hasResultType = true; break;
    case OpArbitraryFloatLog10INTEL: *hasResult = true; *hasResultType = true; break;
    case OpArbitraryFloatLog1pINTEL: *hasResult = true; *hasResultType = true; break;
    case OpArbitraryFloatExpINTEL: *hasResult = true; *hasResultType = true; break;
    case OpArbitraryFloatExp2INTEL: *hasResult = true; *hasResultType = true; break;
    case OpArbitraryFloatExp10INTEL: *hasResult = true; *hasResultType = true; break;
    case OpArbitraryFloatExpm1INTEL: *hasResult = true; *hasResultType = true; break;
    case OpArbitraryFloatSinINTEL: *hasResult = true; *hasResultType = true; break;
    case OpArbitraryFloatCosINTEL: *hasResult = true; *hasResultType = true; break;
    case OpArbitraryFloatSinCosINTEL: *hasResult = true; *hasResultType = true; break;
    case OpArbitraryFloatSinPiINTEL: *hasResult = true; *hasResultType = true; break;
    case OpArbitraryFloatCosPiINTEL: *hasResult = true; *hasResultType = true; break;
    case OpArbitraryFloatASinINTEL: *hasResult = true; *hasResultType = true; break;
    case OpArbitraryFloatASinPiINTEL: *hasResult = true; *hasResultType = true; break;
    case OpArbitraryFloatACosINTEL: *hasResult = true; *hasResultType = true; break;
    case OpArbitraryFloatACosPiINTEL: *hasResult = true; *hasResultType = true; break;
    case OpArbitraryFloatATanINTEL: *hasResult = true; *hasResultType = true; break;
    case OpArbitraryFloatATanPiINTEL: *hasResult = true; *hasResultType = true; break;
    case OpArbitraryFloatATan2INTEL: *hasResult = true; *hasResultType = true; break;
    case OpArbitraryFloatPowINTEL: *hasResult = true; *hasResultType = true; break;
    case OpArbitraryFloatPowRINTEL: *hasResult = true; *hasResultType = true; break;
    case OpArbitraryFloatPowNINTEL: *hasResult = true; *hasResultType = true; break;
    case OpLoopControlINTEL: *hasResult = false; *hasResultType = false; break;
    case OpAliasDomainDeclINTEL: *hasResult = true; *hasResultType = false; break;
    case OpAliasScopeDeclINTEL: *hasResult = true; *hasResultType = false; break;
    case OpAliasScopeListDeclINTEL: *hasResult = true; *hasResultType = false; break;
    case OpFixedSqrtINTEL: *hasResult = true; *hasResultType = true; break;
    case OpFixedRecipINTEL: *hasResult = true; *hasResultType = true; break;
    case OpFixedRsqrtINTEL: *hasResult = true; *hasResultType = true; break;
    case OpFixedSinINTEL: *hasResult = true; *hasResultType = true; break;
    case OpFixedCosINTEL: *hasResult = true; *hasResultType = true; break;
    case OpFixedSinCosINTEL: *hasResult = true; *hasResultType = true; break;
    case OpFixedSinPiINTEL: *hasResult = true; *hasResultType = true; break;
    case OpFixedCosPiINTEL: *hasResult = true; *hasResultType = true; break;
    case OpFixedSinCosPiINTEL: *hasResult = true; *hasResultType = true; break;
    case OpFixedLogINTEL: *hasResult = true; *hasResultType = true; break;
    case OpFixedExpINTEL: *hasResult = true; *hasResultType = true; break;
    case OpPtrCastToCrossWorkgroupINTEL: *hasResult = true; *hasResultType = true; break;
    case OpCrossWorkgroupCastToPtrINTEL: *hasResult = true; *hasResultType = true; break;
    case OpReadPipeBlockingINTEL: *hasResult = true; *hasResultType = true; break;
    case OpWritePipeBlockingINTEL: *hasResult = true; *hasResultType = true; break;
    case OpFPGARegINTEL: *hasResult = true; *hasResultType = true; break;
    case OpRayQueryGetRayTMinKHR: *hasResult = true; *hasResultType = true; break;
    case OpRayQueryGetRayFlagsKHR: *hasResult = true; *hasResultType = true; break;
    case OpRayQueryGetIntersectionTKHR: *hasResult = true; *hasResultType = true; break;
    case OpRayQueryGetIntersectionInstanceCustomIndexKHR: *hasResult = true; *hasResultType = true; break;
    case OpRayQueryGetIntersectionInstanceIdKHR: *hasResult = true; *hasResultType = true; break;
    case OpRayQueryGetIntersectionInstanceShaderBindingTableRecordOffsetKHR: *hasResult = true; *hasResultType = true; break;
    case OpRayQueryGetIntersectionGeometryIndexKHR: *hasResult = true; *hasResultType = true; break;
    case OpRayQueryGetIntersectionPrimitiveIndexKHR: *hasResult = true; *hasResultType = true; break;
    case OpRayQueryGetIntersectionBarycentricsKHR: *hasResult = true; *hasResultType = true; break;
    case OpRayQueryGetIntersectionFrontFaceKHR: *hasResult = true; *hasResultType = true; break;
    case OpRayQueryGetIntersectionCandidateAABBOpaqueKHR: *hasResult = true; *hasResultType = true; break;
    case OpRayQueryGetIntersectionObjectRayDirectionKHR: *hasResult = true; *hasResultType = true; break;
    case OpRayQueryGetIntersectionObjectRayOriginKHR: *hasResult = true; *hasResultType = true; break;
    case OpRayQueryGetWorldRayDirectionKHR: *hasResult = true; *hasResultType = true; break;
    case OpRayQueryGetWorldRayOriginKHR: *hasResult = true; *hasResultType = true; break;
    case OpRayQueryGetIntersectionObjectToWorldKHR: *hasResult = true; *hasResultType = true; break;
    case OpRayQueryGetIntersectionWorldToObjectKHR: *hasResult = true; *hasResultType = true; break;
    case OpAtomicFAddEXT: *hasResult = true; *hasResultType = true; break;
    case OpTypeBufferSurfaceINTEL: *hasResult = true; *hasResultType = false; break;
    case OpTypeStructContinuedINTEL: *hasResult = false; *hasResultType = false; break;
    case OpConstantCompositeContinuedINTEL: *hasResult = false; *hasResultType = false; break;
    case OpSpecConstantCompositeContinuedINTEL: *hasResult = false; *hasResultType = false; break;
    case OpCompositeConstructContinuedINTEL: *hasResult = true; *hasResultType = true; break;
    case OpConvertFToBF16INTEL: *hasResult = true; *hasResultType = true; break;
    case OpConvertBF16ToFINTEL: *hasResult = true; *hasResultType = true; break;
    case OpControlBarrierArriveINTEL: *hasResult = false; *hasResultType = false; break;
    case OpControlBarrierWaitINTEL: *hasResult = false; *hasResultType = false; break;
    case OpArithmeticFenceEXT: *hasResult = true; *hasResultType = true; break;
    case OpSubgroupBlockPrefetchINTEL: *hasResult = false; *hasResultType = false; break;
    case OpGroupIMulKHR: *hasResult = true; *hasResultType = true; break;
    case OpGroupFMulKHR: *hasResult = true; *hasResultType = true; break;
    case OpGroupBitwiseAndKHR: *hasResult = true; *hasResultType = true; break;
    case OpGroupBitwiseOrKHR: *hasResult = true; *hasResultType = true; break;
    case OpGroupBitwiseXorKHR: *hasResult = true; *hasResultType = true; break;
    case OpGroupLogicalAndKHR: *hasResult = true; *hasResultType = true; break;
    case OpGroupLogicalOrKHR: *hasResult = true; *hasResultType = true; break;
    case OpGroupLogicalXorKHR: *hasResult = true; *hasResultType = true; break;
    case OpMaskedGatherINTEL: *hasResult = true; *hasResultType = true; break;
    case OpMaskedScatterINTEL: *hasResult = false; *hasResultType = false; break;
    }
}